

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_h<embree::sse2::RibbonCurve1Intersector1<embree::HermiteCurveT,4>,embree::sse2::Intersect1EpilogMU<4,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [12];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Geometry *pGVar25;
  __int_type_conflict _Var26;
  RTCFilterFunctionN p_Var27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined6 uVar71;
  undefined1 auVar72 [12];
  unkbyte9 Var73;
  undefined1 auVar74 [13];
  undefined1 auVar75 [12];
  undefined1 auVar76 [13];
  undefined1 auVar77 [12];
  undefined1 auVar78 [13];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [13];
  undefined1 auVar84 [12];
  undefined1 auVar85 [13];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  bool bVar97;
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [13];
  undefined1 auVar117 [13];
  undefined1 auVar118 [13];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined8 uVar122;
  undefined8 uVar123;
  undefined4 uVar124;
  ulong uVar125;
  long lVar126;
  RTCRayN *pRVar127;
  RTCIntersectArguments *pRVar129;
  ulong uVar130;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  undefined4 uVar131;
  undefined8 unaff_RBP;
  long lVar133;
  long lVar134;
  long lVar135;
  long lVar136;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  char cVar142;
  short sVar143;
  char cVar195;
  undefined1 uVar196;
  undefined1 uVar198;
  undefined2 uVar197;
  int iVar144;
  float fVar145;
  undefined1 auVar147 [12];
  int iVar199;
  char cVar203;
  undefined1 auVar152 [16];
  undefined1 auVar156 [16];
  undefined1 auVar148 [12];
  undefined1 auVar160 [16];
  float fVar204;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar149 [12];
  undefined1 auVar169 [16];
  undefined1 auVar150 [12];
  undefined1 auVar173 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar202;
  float fVar205;
  float fVar206;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar190;
  undefined1 auVar191 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar192;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar193;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar194;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  char cVar226;
  char cVar249;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar250;
  undefined1 auVar251 [12];
  char cVar270;
  float fVar271;
  undefined1 auVar252 [16];
  undefined1 auVar256 [16];
  undefined1 auVar260 [16];
  float fVar272;
  float fVar273;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar280 [12];
  float fVar316;
  undefined1 auVar285 [16];
  undefined1 auVar289 [16];
  float fVar318;
  undefined1 auVar293 [16];
  undefined1 auVar282 [12];
  undefined1 auVar297 [16];
  undefined1 auVar283 [12];
  undefined1 auVar301 [16];
  float fVar321;
  float fVar324;
  float fVar327;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar328;
  float fVar329;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar330;
  float fVar331;
  float fVar339;
  float fVar341;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  float fVar340;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  float fVar342;
  float fVar343;
  float fVar347;
  float fVar350;
  undefined1 auVar344 [16];
  float fVar348;
  float fVar349;
  float fVar351;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar352;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar358;
  float fVar359;
  float fVar362;
  float fVar363;
  float fVar364;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar378;
  float fVar382;
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar383;
  float fVar384;
  float fVar385;
  undefined1 auVar377 [16];
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar393;
  float fVar396;
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  float fVar394;
  float fVar395;
  float fVar397;
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  float fVar398;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar410;
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  float fVar411;
  float fVar412;
  float fVar416;
  float fVar417;
  float fVar418;
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  float fVar419;
  undefined1 auVar415 [16];
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  float fVar434;
  undefined1 auVar424 [16];
  float fVar435;
  undefined1 auVar425 [16];
  float fVar436;
  float fVar437;
  undefined1 local_468 [6];
  undefined2 uStack_462;
  float fStack_460;
  char local_458;
  char cStack_457;
  undefined1 uStack_456;
  undefined1 uStack_455;
  undefined1 local_448;
  undefined1 uStack_447;
  undefined1 uStack_446;
  undefined1 uStack_445;
  int local_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined8 local_408;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [6];
  undefined2 uStack_3f2;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  int iStack_3e0;
  int iStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined8 local_3b8;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  RTCIntersectArguments *local_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  ulong local_360;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  undefined8 local_248;
  float local_240;
  float local_23c;
  float local_238;
  undefined4 local_234;
  undefined4 local_230;
  uint local_22c;
  uint local_228;
  RayHit *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  ulong uVar128;
  ulong uVar132;
  undefined1 auVar146 [12];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar174 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [16];
  undefined1 auVar175 [16];
  undefined1 auVar151 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar168 [16];
  undefined1 auVar172 [16];
  undefined1 auVar176 [16];
  int iVar200;
  int iVar201;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar253 [16];
  undefined1 auVar257 [16];
  undefined1 auVar254 [16];
  undefined1 auVar258 [16];
  undefined1 auVar255 [16];
  undefined1 auVar259 [16];
  undefined1 auVar279 [12];
  undefined1 auVar281 [12];
  undefined1 auVar286 [16];
  undefined1 auVar290 [16];
  undefined1 auVar294 [16];
  undefined1 auVar298 [16];
  undefined1 auVar302 [16];
  undefined1 auVar284 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar303 [16];
  int iVar317;
  int iVar319;
  int iVar320;
  undefined1 auVar334 [16];
  
  uVar123 = mm_lookupmask_ps._8_8_;
  uVar122 = mm_lookupmask_ps._0_8_;
  PVar17 = prim[1];
  uVar125 = (ulong)(byte)PVar17;
  lVar134 = uVar125 * 0x25;
  uVar131 = *(undefined4 *)(prim + uVar125 * 4 + 6);
  uVar18 = *(undefined4 *)(prim + uVar125 * 5 + 6);
  uVar19 = *(undefined4 *)(prim + uVar125 * 6 + 6);
  uVar124 = *(undefined4 *)(prim + uVar125 * 0xf + 6);
  uVar20 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar21 = *(undefined4 *)(prim + uVar125 * 0x11 + 6);
  uVar22 = *(undefined4 *)(prim + uVar125 * 0x1a + 6);
  uVar23 = *(undefined4 *)(prim + uVar125 * 0x1b + 6);
  uVar24 = *(undefined4 *)(prim + uVar125 * 0x1c + 6);
  pPVar7 = prim + lVar134 + 6;
  fVar406 = *(float *)(pPVar7 + 0xc);
  fVar330 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar7) * fVar406;
  fVar339 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar7 + 4)) * fVar406;
  fVar341 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar7 + 8)) * fVar406;
  fVar398 = fVar406 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar404 = fVar406 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar406 = fVar406 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar198 = (undefined1)((uint)uVar22 >> 0x18);
  uVar197 = CONCAT11((char)((uint)uVar18 >> 0x18),uVar198);
  uVar196 = (undefined1)((uint)uVar22 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar197,(char)((uint)uVar18 >> 0x10)),CONCAT14(uVar196,uVar22));
  cVar249 = (char)((uint)uVar18 >> 8);
  cVar195 = (char)((uint)uVar22 >> 8);
  uVar71 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),cVar249),cVar195);
  cVar142 = (char)uVar22;
  cVar226 = (char)uVar18;
  uVar132 = CONCAT62(uVar71,CONCAT11(cVar226,cVar142));
  auVar241._8_4_ = 0;
  auVar241._0_8_ = uVar132;
  auVar241._12_2_ = uVar197;
  auVar241._14_2_ = uVar197;
  uVar197 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar164._12_4_ = auVar241._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar132;
  auVar164._10_2_ = uVar197;
  auVar308._10_6_ = auVar164._10_6_;
  auVar308._8_2_ = uVar197;
  auVar308._0_8_ = uVar132;
  uVar197 = (undefined2)uVar71;
  auVar72._4_8_ = auVar308._8_8_;
  auVar72._2_2_ = uVar197;
  auVar72._0_2_ = uVar197;
  iVar144 = (int)CONCAT11(cVar226,cVar142) >> 8;
  iVar199 = auVar72._0_4_ >> 0x18;
  auVar146._0_8_ = CONCAT44(iVar199,iVar144);
  auVar146._8_4_ = auVar308._8_4_ >> 0x18;
  auVar151._12_4_ = auVar164._12_4_ >> 0x18;
  auVar151._0_12_ = auVar146;
  fVar355 = (float)iVar199;
  cVar203 = cVar249 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar151._0_13_;
  auVar31[0xe] = cVar203;
  auVar36[0xc] = cVar203;
  auVar36._0_12_ = auVar146;
  auVar36._13_2_ = auVar31._13_2_;
  auVar41[0xb] = 0;
  auVar41._0_11_ = auVar146._0_11_;
  auVar41._12_3_ = auVar36._12_3_;
  auVar46[10] = cVar203;
  auVar46._0_10_ = auVar146._0_10_;
  auVar46._11_4_ = auVar41._11_4_;
  auVar51[9] = 0;
  auVar51._0_9_ = auVar146._0_9_;
  auVar51._10_5_ = auVar46._10_5_;
  auVar56[8] = cVar249;
  auVar56._0_8_ = auVar146._0_8_;
  auVar56._9_6_ = auVar51._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar56._8_7_,(char)((uint)uVar19 >> 0x18)),(short)cVar226 >> 7);
  auVar61._6_9_ = Var73;
  auVar61[5] = (char)((uint)uVar19 >> 0x10);
  auVar61[4] = (undefined1)((short)cVar226 >> 7);
  auVar61._0_4_ = iVar144;
  cVar270 = (char)((uint)uVar19 >> 8);
  auVar74._2_11_ = auVar61._4_11_;
  auVar74[1] = cVar270;
  auVar74[0] = (undefined1)((short)cVar226 >> 7);
  cVar249 = (char)uVar19;
  auVar66._2_13_ = auVar74;
  auVar66._0_2_ = CONCAT11(cVar249,cVar226);
  uVar197 = (undefined2)Var73;
  auVar154._0_12_ = auVar66._0_12_;
  auVar154._12_2_ = uVar197;
  auVar154._14_2_ = uVar197;
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._0_10_ = auVar66._0_10_;
  auVar153._10_2_ = auVar61._4_2_;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._0_8_ = auVar66._0_8_;
  auVar152._8_2_ = auVar61._4_2_;
  auVar75._4_8_ = auVar152._8_8_;
  auVar75._2_2_ = auVar74._0_2_;
  auVar75._0_2_ = auVar74._0_2_;
  iVar199 = (int)CONCAT11(cVar249,cVar226) >> 8;
  iVar200 = auVar75._0_4_ >> 0x18;
  auVar147._0_8_ = CONCAT44(iVar200,iVar199);
  auVar147._8_4_ = auVar152._8_4_ >> 0x18;
  auVar155._12_4_ = auVar153._12_4_ >> 0x18;
  auVar155._0_12_ = auVar147;
  fVar367 = (float)iVar200;
  cVar203 = cVar270 >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar155._0_13_;
  auVar32[0xe] = cVar203;
  auVar37[0xc] = cVar203;
  auVar37._0_12_ = auVar147;
  auVar37._13_2_ = auVar32._13_2_;
  auVar42[0xb] = 0;
  auVar42._0_11_ = auVar147._0_11_;
  auVar42._12_3_ = auVar37._12_3_;
  auVar47[10] = cVar203;
  auVar47._0_10_ = auVar147._0_10_;
  auVar47._11_4_ = auVar42._11_4_;
  auVar52[9] = 0;
  auVar52._0_9_ = auVar147._0_9_;
  auVar52._10_5_ = auVar47._10_5_;
  auVar57[8] = cVar270;
  auVar57._0_8_ = auVar147._0_8_;
  auVar57._9_6_ = auVar52._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar57._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar249 >> 7);
  auVar62._6_9_ = Var73;
  auVar62[5] = (char)((uint)uVar20 >> 0x10);
  auVar62[4] = (undefined1)((short)cVar249 >> 7);
  auVar62._0_4_ = iVar199;
  cVar270 = (char)((uint)uVar20 >> 8);
  auVar76._2_11_ = auVar62._4_11_;
  auVar76[1] = cVar270;
  auVar76[0] = (undefined1)((short)cVar249 >> 7);
  cVar226 = (char)uVar20;
  auVar67._2_13_ = auVar76;
  auVar67._0_2_ = CONCAT11(cVar226,cVar249);
  uVar197 = (undefined2)Var73;
  auVar158._0_12_ = auVar67._0_12_;
  auVar158._12_2_ = uVar197;
  auVar158._14_2_ = uVar197;
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._0_10_ = auVar67._0_10_;
  auVar157._10_2_ = auVar62._4_2_;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._0_8_ = auVar67._0_8_;
  auVar156._8_2_ = auVar62._4_2_;
  auVar77._4_8_ = auVar156._8_8_;
  auVar77._2_2_ = auVar76._0_2_;
  auVar77._0_2_ = auVar76._0_2_;
  iVar200 = (int)CONCAT11(cVar226,cVar249) >> 8;
  iVar201 = auVar77._0_4_ >> 0x18;
  auVar148._0_8_ = CONCAT44(iVar201,iVar200);
  auVar148._8_4_ = auVar156._8_4_ >> 0x18;
  auVar159._12_4_ = auVar157._12_4_ >> 0x18;
  auVar159._0_12_ = auVar148;
  fVar352 = (float)iVar201;
  cVar203 = cVar270 >> 7;
  auVar33[0xd] = 0;
  auVar33._0_13_ = auVar159._0_13_;
  auVar33[0xe] = cVar203;
  auVar38[0xc] = cVar203;
  auVar38._0_12_ = auVar148;
  auVar38._13_2_ = auVar33._13_2_;
  auVar43[0xb] = 0;
  auVar43._0_11_ = auVar148._0_11_;
  auVar43._12_3_ = auVar38._12_3_;
  auVar48[10] = cVar203;
  auVar48._0_10_ = auVar148._0_10_;
  auVar48._11_4_ = auVar43._11_4_;
  auVar53[9] = 0;
  auVar53._0_9_ = auVar148._0_9_;
  auVar53._10_5_ = auVar48._10_5_;
  auVar58[8] = cVar270;
  auVar58._0_8_ = auVar148._0_8_;
  auVar58._9_6_ = auVar53._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar58._8_7_,(char)((uint)uVar21 >> 0x18)),(short)cVar226 >> 7);
  auVar63._6_9_ = Var73;
  auVar63[5] = (char)((uint)uVar21 >> 0x10);
  auVar63[4] = (undefined1)((short)cVar226 >> 7);
  auVar63._0_4_ = iVar200;
  auVar78._2_11_ = auVar63._4_11_;
  auVar78[1] = (char)((uint)uVar21 >> 8);
  auVar78[0] = (undefined1)((short)cVar226 >> 7);
  sVar143 = CONCAT11((char)uVar21,cVar226);
  auVar68._2_13_ = auVar78;
  auVar68._0_2_ = sVar143;
  uVar197 = (undefined2)Var73;
  auVar162._0_12_ = auVar68._0_12_;
  auVar162._12_2_ = uVar197;
  auVar162._14_2_ = uVar197;
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._0_10_ = auVar68._0_10_;
  auVar161._10_2_ = auVar63._4_2_;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._0_8_ = auVar68._0_8_;
  auVar160._8_2_ = auVar63._4_2_;
  auVar79._4_8_ = auVar160._8_8_;
  auVar79._2_2_ = auVar78._0_2_;
  auVar79._0_2_ = auVar78._0_2_;
  fVar359 = (float)((int)sVar143 >> 8);
  fVar362 = (float)(auVar79._0_4_ >> 0x18);
  fVar363 = (float)(auVar160._8_4_ >> 0x18);
  fVar274 = fVar406 * fVar359;
  fVar316 = fVar406 * fVar362;
  auVar279._0_8_ = CONCAT44(fVar316,fVar274);
  auVar279._8_4_ = fVar406 * fVar363;
  auVar284._12_4_ = fVar406 * (float)(auVar161._12_4_ >> 0x18);
  auVar284._0_12_ = auVar279;
  fVar411 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar134 + 0x16)) *
            *(float *)(prim + lVar134 + 0x1a);
  local_458 = (char)uVar131;
  cStack_457 = (char)((uint)uVar131 >> 8);
  uStack_456 = (undefined1)((uint)uVar131 >> 0x10);
  uStack_455 = (undefined1)((uint)uVar131 >> 0x18);
  auVar94[0xd] = 0;
  auVar94._0_13_ = auVar284._0_13_;
  auVar94[0xe] = (char)((uint)fVar316 >> 0x18);
  auVar98[0xc] = (char)((uint)fVar316 >> 0x10);
  auVar98._0_12_ = auVar279;
  auVar98._13_2_ = auVar94._13_2_;
  auVar101[0xb] = 0;
  auVar101._0_11_ = auVar279._0_11_;
  auVar101._12_3_ = auVar98._12_3_;
  auVar104[10] = (char)((uint)fVar316 >> 8);
  auVar104._0_10_ = auVar279._0_10_;
  auVar104._11_4_ = auVar101._11_4_;
  auVar107[9] = 0;
  auVar107._0_9_ = auVar279._0_9_;
  auVar107._10_5_ = auVar104._10_5_;
  auVar110[8] = SUB41(fVar316,0);
  auVar110._0_8_ = auVar279._0_8_;
  auVar110._9_6_ = auVar107._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar110._8_7_,uStack_455),(char)((uint)fVar274 >> 0x18));
  auVar113._6_9_ = Var73;
  auVar113[5] = uStack_456;
  auVar113[4] = (char)((uint)fVar274 >> 0x10);
  auVar113._0_4_ = fVar274;
  auVar116._2_11_ = auVar113._4_11_;
  auVar116[1] = cStack_457;
  auVar116[0] = (char)((uint)fVar274 >> 8);
  sVar143 = CONCAT11(local_458,SUB41(fVar274,0));
  auVar119._2_13_ = auVar116;
  auVar119._0_2_ = sVar143;
  uVar197 = (undefined2)Var73;
  auVar287._0_12_ = auVar119._0_12_;
  auVar287._12_2_ = uVar197;
  auVar287._14_2_ = uVar197;
  auVar286._12_4_ = auVar287._12_4_;
  auVar286._0_10_ = auVar119._0_10_;
  auVar286._10_2_ = auVar113._4_2_;
  auVar285._10_6_ = auVar286._10_6_;
  auVar285._0_8_ = auVar119._0_8_;
  auVar285._8_2_ = auVar113._4_2_;
  auVar80._4_8_ = auVar285._8_8_;
  auVar80._2_2_ = auVar116._0_2_;
  auVar80._0_2_ = auVar116._0_2_;
  iVar201 = (int)sVar143 >> 8;
  iVar317 = auVar80._0_4_ >> 0x18;
  auVar280._0_8_ = CONCAT44(iVar317,iVar201);
  auVar280._8_4_ = auVar285._8_4_ >> 0x18;
  auVar288._12_4_ = auVar286._12_4_ >> 0x18;
  auVar288._0_12_ = auVar280;
  fVar347 = (float)iVar317;
  local_448 = (undefined1)uVar124;
  uStack_447 = (undefined1)((uint)uVar124 >> 8);
  uStack_446 = (undefined1)((uint)uVar124 >> 0x10);
  uStack_445 = (undefined1)((uint)uVar124 >> 0x18);
  cVar203 = cStack_457 >> 7;
  auVar95[0xd] = 0;
  auVar95._0_13_ = auVar288._0_13_;
  auVar95[0xe] = cVar203;
  auVar99[0xc] = cVar203;
  auVar99._0_12_ = auVar280;
  auVar99._13_2_ = auVar95._13_2_;
  auVar102[0xb] = 0;
  auVar102._0_11_ = auVar280._0_11_;
  auVar102._12_3_ = auVar99._12_3_;
  auVar105[10] = cVar203;
  auVar105._0_10_ = auVar280._0_10_;
  auVar105._11_4_ = auVar102._11_4_;
  auVar108[9] = 0;
  auVar108._0_9_ = auVar280._0_9_;
  auVar108._10_5_ = auVar105._10_5_;
  auVar111[8] = cStack_457;
  auVar111._0_8_ = auVar280._0_8_;
  auVar111._9_6_ = auVar108._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar111._8_7_,uStack_445),(short)local_458 >> 7);
  auVar114._6_9_ = Var73;
  auVar114[5] = uStack_446;
  auVar114[4] = (undefined1)((short)local_458 >> 7);
  auVar114._0_4_ = iVar201;
  auVar117._2_11_ = auVar114._4_11_;
  auVar117[1] = uStack_447;
  auVar117[0] = (undefined1)((short)local_458 >> 7);
  auVar120._2_13_ = auVar117;
  auVar120._0_2_ = CONCAT11(local_448,local_458);
  uVar197 = (undefined2)Var73;
  auVar291._0_12_ = auVar120._0_12_;
  auVar291._12_2_ = uVar197;
  auVar291._14_2_ = uVar197;
  auVar290._12_4_ = auVar291._12_4_;
  auVar290._0_10_ = auVar120._0_10_;
  auVar290._10_2_ = auVar114._4_2_;
  auVar289._10_6_ = auVar290._10_6_;
  auVar289._0_8_ = auVar120._0_8_;
  auVar289._8_2_ = auVar114._4_2_;
  auVar81._4_8_ = auVar289._8_8_;
  auVar81._2_2_ = auVar117._0_2_;
  auVar81._0_2_ = auVar117._0_2_;
  fVar275 = (float)((int)CONCAT11(local_448,local_458) >> 8);
  fVar318 = (float)(auVar81._0_4_ >> 0x18);
  auVar281._0_8_ = CONCAT44(fVar318,fVar275);
  auVar281._8_4_ = (float)(auVar289._8_4_ >> 0x18);
  auVar292._12_4_ = (float)(auVar290._12_4_ >> 0x18);
  auVar292._0_12_ = auVar281;
  auVar96[0xd] = 0;
  auVar96._0_13_ = auVar292._0_13_;
  auVar96[0xe] = (char)((uint)fVar318 >> 0x18);
  auVar100[0xc] = (char)((uint)fVar318 >> 0x10);
  auVar100._0_12_ = auVar281;
  auVar100._13_2_ = auVar96._13_2_;
  auVar103[0xb] = 0;
  auVar103._0_11_ = auVar281._0_11_;
  auVar103._12_3_ = auVar100._12_3_;
  auVar106[10] = (char)((uint)fVar318 >> 8);
  auVar106._0_10_ = auVar281._0_10_;
  auVar106._11_4_ = auVar103._11_4_;
  auVar109[9] = 0;
  auVar109._0_9_ = auVar281._0_9_;
  auVar109._10_5_ = auVar106._10_5_;
  auVar112[8] = SUB41(fVar318,0);
  auVar112._0_8_ = auVar281._0_8_;
  auVar112._9_6_ = auVar109._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar112._8_7_,uVar198),(char)((uint)fVar275 >> 0x18));
  auVar115._6_9_ = Var73;
  auVar115[5] = uVar196;
  auVar115[4] = (char)((uint)fVar275 >> 0x10);
  auVar115._0_4_ = fVar275;
  auVar118._2_11_ = auVar115._4_11_;
  auVar118[1] = cVar195;
  auVar118[0] = (char)((uint)fVar275 >> 8);
  sVar143 = CONCAT11(cVar142,SUB41(fVar275,0));
  auVar121._2_13_ = auVar118;
  auVar121._0_2_ = sVar143;
  uVar197 = (undefined2)Var73;
  auVar295._0_12_ = auVar121._0_12_;
  auVar295._12_2_ = uVar197;
  auVar295._14_2_ = uVar197;
  auVar294._12_4_ = auVar295._12_4_;
  auVar294._0_10_ = auVar121._0_10_;
  auVar294._10_2_ = auVar115._4_2_;
  auVar293._10_6_ = auVar294._10_6_;
  auVar293._0_8_ = auVar121._0_8_;
  auVar293._8_2_ = auVar115._4_2_;
  auVar82._4_8_ = auVar293._8_8_;
  auVar82._2_2_ = auVar118._0_2_;
  auVar82._0_2_ = auVar118._0_2_;
  iVar317 = (int)sVar143 >> 8;
  iVar319 = auVar82._0_4_ >> 0x18;
  auVar282._0_8_ = CONCAT44(iVar319,iVar317);
  auVar282._8_4_ = auVar293._8_4_ >> 0x18;
  auVar296._12_4_ = auVar294._12_4_ >> 0x18;
  auVar296._0_12_ = auVar282;
  fVar378 = (float)iVar319;
  cVar203 = cVar195 >> 7;
  auVar34[0xd] = 0;
  auVar34._0_13_ = auVar296._0_13_;
  auVar34[0xe] = cVar203;
  auVar39[0xc] = cVar203;
  auVar39._0_12_ = auVar282;
  auVar39._13_2_ = auVar34._13_2_;
  auVar44[0xb] = 0;
  auVar44._0_11_ = auVar282._0_11_;
  auVar44._12_3_ = auVar39._12_3_;
  auVar49[10] = cVar203;
  auVar49._0_10_ = auVar282._0_10_;
  auVar49._11_4_ = auVar44._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar282._0_9_;
  auVar54._10_5_ = auVar49._10_5_;
  auVar59[8] = cVar195;
  auVar59._0_8_ = auVar282._0_8_;
  auVar59._9_6_ = auVar54._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar142 >> 7);
  auVar64._6_9_ = Var73;
  auVar64[5] = (char)((uint)uVar23 >> 0x10);
  auVar64[4] = (undefined1)((short)cVar142 >> 7);
  auVar64._0_4_ = iVar317;
  cVar203 = (char)((uint)uVar23 >> 8);
  auVar83._2_11_ = auVar64._4_11_;
  auVar83[1] = cVar203;
  auVar83[0] = (undefined1)((short)cVar142 >> 7);
  cVar195 = (char)uVar23;
  auVar69._2_13_ = auVar83;
  auVar69._0_2_ = CONCAT11(cVar195,cVar142);
  uVar197 = (undefined2)Var73;
  auVar299._0_12_ = auVar69._0_12_;
  auVar299._12_2_ = uVar197;
  auVar299._14_2_ = uVar197;
  auVar298._12_4_ = auVar299._12_4_;
  auVar298._0_10_ = auVar69._0_10_;
  auVar298._10_2_ = auVar64._4_2_;
  auVar297._10_6_ = auVar298._10_6_;
  auVar297._0_8_ = auVar69._0_8_;
  auVar297._8_2_ = auVar64._4_2_;
  auVar84._4_8_ = auVar297._8_8_;
  auVar84._2_2_ = auVar83._0_2_;
  auVar84._0_2_ = auVar83._0_2_;
  iVar319 = (int)CONCAT11(cVar195,cVar142) >> 8;
  iVar320 = auVar84._0_4_ >> 0x18;
  auVar283._0_8_ = CONCAT44(iVar320,iVar319);
  auVar283._8_4_ = auVar297._8_4_ >> 0x18;
  auVar300._12_4_ = auVar298._12_4_ >> 0x18;
  auVar300._0_12_ = auVar283;
  fVar426 = (float)iVar320;
  cVar142 = cVar203 >> 7;
  auVar35[0xd] = 0;
  auVar35._0_13_ = auVar300._0_13_;
  auVar35[0xe] = cVar142;
  auVar40[0xc] = cVar142;
  auVar40._0_12_ = auVar283;
  auVar40._13_2_ = auVar35._13_2_;
  auVar45[0xb] = 0;
  auVar45._0_11_ = auVar283._0_11_;
  auVar45._12_3_ = auVar40._12_3_;
  auVar50[10] = cVar142;
  auVar50._0_10_ = auVar283._0_10_;
  auVar50._11_4_ = auVar45._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar283._0_9_;
  auVar55._10_5_ = auVar50._10_5_;
  auVar60[8] = cVar203;
  auVar60._0_8_ = auVar283._0_8_;
  auVar60._9_6_ = auVar55._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar195 >> 7);
  auVar65._6_9_ = Var73;
  auVar65[5] = (char)((uint)uVar24 >> 0x10);
  auVar65[4] = (undefined1)((short)cVar195 >> 7);
  auVar65._0_4_ = iVar319;
  auVar85._2_11_ = auVar65._4_11_;
  auVar85[1] = (char)((uint)uVar24 >> 8);
  auVar85[0] = (undefined1)((short)cVar195 >> 7);
  sVar143 = CONCAT11((char)uVar24,cVar195);
  auVar70._2_13_ = auVar85;
  auVar70._0_2_ = sVar143;
  uVar197 = (undefined2)Var73;
  auVar303._0_12_ = auVar70._0_12_;
  auVar303._12_2_ = uVar197;
  auVar303._14_2_ = uVar197;
  auVar302._12_4_ = auVar303._12_4_;
  auVar302._0_10_ = auVar70._0_10_;
  auVar302._10_2_ = auVar65._4_2_;
  auVar301._10_6_ = auVar302._10_6_;
  auVar301._0_8_ = auVar70._0_8_;
  auVar301._8_2_ = auVar65._4_2_;
  auVar86._4_8_ = auVar301._8_8_;
  auVar86._2_2_ = auVar85._0_2_;
  auVar86._0_2_ = auVar85._0_2_;
  fVar386 = (float)((int)sVar143 >> 8);
  fVar393 = (float)(auVar86._0_4_ >> 0x18);
  fVar396 = (float)(auVar301._8_4_ >> 0x18);
  fVar276 = fVar398 * (float)iVar201 + fVar404 * (float)iVar144 + fVar406 * (float)iVar199;
  fVar321 = fVar398 * fVar347 + fVar404 * fVar355 + fVar406 * fVar367;
  fVar324 = fVar398 * (float)auVar280._8_4_ +
            fVar404 * (float)auVar146._8_4_ + fVar406 * (float)auVar147._8_4_;
  fVar327 = fVar398 * (float)auVar288._12_4_ +
            fVar404 * (float)auVar151._12_4_ + fVar406 * (float)auVar155._12_4_;
  fVar420 = fVar398 * fVar275 + fVar404 * (float)iVar200 + fVar274;
  fVar427 = fVar398 * fVar318 + fVar404 * fVar352 + fVar316;
  fVar431 = fVar398 * auVar281._8_4_ + fVar404 * (float)auVar148._8_4_ + auVar279._8_4_;
  fVar434 = fVar398 * auVar292._12_4_ + fVar404 * (float)auVar159._12_4_ + auVar284._12_4_;
  fVar274 = fVar398 * (float)iVar317 + fVar404 * (float)iVar319 + fVar406 * fVar386;
  fVar316 = fVar398 * fVar378 + fVar404 * fVar426 + fVar406 * fVar393;
  fVar204 = fVar398 * (float)auVar282._8_4_ + fVar404 * (float)auVar283._8_4_ + fVar406 * fVar396;
  fVar406 = fVar398 * (float)auVar296._12_4_ +
            fVar404 * (float)auVar300._12_4_ + fVar406 * (float)(auVar302._12_4_ >> 0x18);
  uVar132 = *(ulong *)(prim + uVar125 * 7 + 6);
  _fStack_3f0 = 0;
  _local_3f8 = uVar132;
  auVar308 = _local_3f8;
  uVar10 = *(undefined8 *)(prim + uVar125 * 0xb + 6);
  fStack_400 = 0.0;
  fStack_3fc = 0.0;
  uVar11 = *(undefined8 *)(prim + uVar125 * 9 + 6);
  uVar12 = *(undefined8 *)(prim + uVar125 * 0xd + 6);
  uVar13 = *(undefined8 *)(prim + uVar125 * 0x12 + 6);
  fVar404 = (float)iVar201 * fVar330 + (float)iVar144 * fVar339 + (float)iVar199 * fVar341;
  fVar405 = fVar347 * fVar330 + fVar355 * fVar339 + fVar367 * fVar341;
  fVar407 = (float)auVar280._8_4_ * fVar330 +
            (float)auVar146._8_4_ * fVar339 + (float)auVar147._8_4_ * fVar341;
  fVar409 = (float)auVar288._12_4_ * fVar330 +
            (float)auVar151._12_4_ * fVar339 + (float)auVar155._12_4_ * fVar341;
  fVar367 = fVar275 * fVar330 + (float)iVar200 * fVar339 + fVar359 * fVar341;
  fVar362 = fVar318 * fVar330 + fVar352 * fVar339 + fVar362 * fVar341;
  fVar363 = auVar281._8_4_ * fVar330 + (float)auVar148._8_4_ * fVar339 + fVar363 * fVar341;
  fVar398 = auVar292._12_4_ * fVar330 +
            (float)auVar159._12_4_ * fVar339 + (float)(auVar161._12_4_ >> 0x18) * fVar341;
  fVar347 = fVar330 * (float)iVar317 + fVar339 * (float)iVar319 + fVar341 * fVar386;
  fVar352 = fVar330 * fVar378 + fVar339 * fVar426 + fVar341 * fVar393;
  fVar355 = fVar330 * (float)auVar282._8_4_ + fVar339 * (float)auVar283._8_4_ + fVar341 * fVar396;
  fVar359 = fVar330 * (float)auVar296._12_4_ +
            fVar339 * (float)auVar300._12_4_ + fVar341 * (float)(auVar302._12_4_ >> 0x18);
  auVar252._0_4_ = (float)DAT_01f4bd50;
  fVar275 = DAT_01f4bd50._4_4_;
  fVar318 = DAT_01f4bd50._8_4_;
  auVar255._0_12_ = DAT_01f4bd50._0_12_;
  fVar330 = DAT_01f4bd50._12_4_;
  uVar137 = -(uint)(auVar252._0_4_ <= ABS(fVar276));
  uVar138 = -(uint)(fVar275 <= ABS(fVar321));
  uVar139 = -(uint)(fVar318 <= ABS(fVar324));
  uVar140 = -(uint)(fVar330 <= ABS(fVar327));
  auVar304._0_4_ = (uint)fVar276 & uVar137;
  auVar304._4_4_ = (uint)fVar321 & uVar138;
  auVar304._8_4_ = (uint)fVar324 & uVar139;
  auVar304._12_4_ = (uint)fVar327 & uVar140;
  auVar227._0_4_ = ~uVar137 & (uint)auVar252._0_4_;
  auVar227._4_4_ = ~uVar138 & (uint)fVar275;
  auVar227._8_4_ = ~uVar139 & (uint)fVar318;
  auVar227._12_4_ = ~uVar140 & (uint)fVar330;
  auVar227 = auVar227 | auVar304;
  uVar137 = -(uint)(auVar252._0_4_ <= ABS(fVar420));
  uVar138 = -(uint)(fVar275 <= ABS(fVar427));
  uVar139 = -(uint)(fVar318 <= ABS(fVar431));
  uVar140 = -(uint)(fVar330 <= ABS(fVar434));
  auVar424._0_4_ = (uint)fVar420 & uVar137;
  auVar424._4_4_ = (uint)fVar427 & uVar138;
  auVar424._8_4_ = (uint)fVar431 & uVar139;
  auVar424._12_4_ = (uint)fVar434 & uVar140;
  auVar305._0_4_ = ~uVar137 & (uint)auVar252._0_4_;
  auVar305._4_4_ = ~uVar138 & (uint)fVar275;
  auVar305._8_4_ = ~uVar139 & (uint)fVar318;
  auVar305._12_4_ = ~uVar140 & (uint)fVar330;
  auVar305 = auVar305 | auVar424;
  uVar137 = -(uint)(auVar252._0_4_ <= ABS(fVar274));
  uVar138 = -(uint)(fVar275 <= ABS(fVar316));
  uVar139 = -(uint)(fVar318 <= ABS(fVar204));
  uVar140 = -(uint)(fVar330 <= ABS(fVar406));
  auVar163._0_4_ = (uint)fVar274 & uVar137;
  auVar163._4_4_ = (uint)fVar316 & uVar138;
  auVar163._8_4_ = (uint)fVar204 & uVar139;
  auVar163._12_4_ = (uint)fVar406 & uVar140;
  auVar332._0_4_ = ~uVar137 & (uint)auVar252._0_4_;
  auVar332._4_4_ = ~uVar138 & (uint)fVar275;
  auVar332._8_4_ = ~uVar139 & (uint)fVar318;
  auVar332._12_4_ = ~uVar140 & (uint)fVar330;
  auVar332 = auVar332 | auVar163;
  auVar164 = rcpps(auVar163,auVar227);
  local_3c8 = auVar164._0_4_;
  fStack_3c4 = auVar164._4_4_;
  fStack_3c0 = auVar164._8_4_;
  fStack_3bc = auVar164._12_4_;
  local_3c8 = (1.0 - auVar227._0_4_ * local_3c8) * local_3c8 + local_3c8;
  fStack_3c4 = (1.0 - auVar227._4_4_ * fStack_3c4) * fStack_3c4 + fStack_3c4;
  fStack_3c0 = (1.0 - auVar227._8_4_ * fStack_3c0) * fStack_3c0 + fStack_3c0;
  fStack_3bc = (1.0 - auVar227._12_4_ * fStack_3bc) * fStack_3bc + fStack_3bc;
  auVar164 = rcpps(auVar164,auVar305);
  local_3d8 = auVar164._0_4_;
  fStack_3d4 = auVar164._4_4_;
  fStack_3d0 = auVar164._8_4_;
  fStack_3cc = auVar164._12_4_;
  local_3d8 = (1.0 - auVar305._0_4_ * local_3d8) * local_3d8 + local_3d8;
  fStack_3d4 = (1.0 - auVar305._4_4_ * fStack_3d4) * fStack_3d4 + fStack_3d4;
  fStack_3d0 = (1.0 - auVar305._8_4_ * fStack_3d0) * fStack_3d0 + fStack_3d0;
  fStack_3cc = (1.0 - auVar305._12_4_ * fStack_3cc) * fStack_3cc + fStack_3cc;
  auVar164 = rcpps(auVar164,auVar332);
  auVar165._0_4_ = auVar164._0_4_;
  fVar406 = auVar164._4_4_;
  fVar276 = auVar164._8_4_;
  fVar341 = auVar164._12_4_;
  uVar128 = *(ulong *)(prim + uVar125 * 0x16 + 6);
  fVar378 = (1.0 - auVar332._0_4_ * auVar165._0_4_) * auVar165._0_4_ + auVar165._0_4_;
  fVar406 = (1.0 - auVar332._4_4_ * fVar406) * fVar406 + fVar406;
  fVar276 = (1.0 - auVar332._8_4_ * fVar276) * fVar276 + fVar276;
  fVar341 = (1.0 - auVar332._12_4_ * fVar341) * fVar341 + fVar341;
  local_3f8._0_2_ = (undefined2)uVar132;
  local_3f8._2_2_ = (undefined2)(uVar132 >> 0x10);
  local_3f8._4_2_ = (undefined2)(uVar132 >> 0x20);
  uStack_3f2 = (undefined2)(uVar132 >> 0x30);
  auVar168._0_12_ = auVar164._0_12_;
  auVar168._12_2_ = auVar164._6_2_;
  auVar168._14_2_ = uStack_3f2;
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._0_10_ = auVar164._0_10_;
  auVar167._10_2_ = local_3f8._4_2_;
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._0_8_ = auVar164._0_8_;
  auVar166._8_2_ = auVar164._4_2_;
  auVar165._8_8_ = auVar166._8_8_;
  auVar165._6_2_ = local_3f8._2_2_;
  auVar165._4_2_ = auVar164._2_2_;
  auVar169._0_4_ = (float)(int)(short)local_3f8._0_2_;
  fVar274 = (float)(auVar165._4_4_ >> 0x10);
  auVar149._0_8_ = CONCAT44(fVar274,auVar169._0_4_);
  auVar149._8_4_ = (float)(auVar166._8_4_ >> 0x10);
  local_408._0_2_ = (short)uVar10;
  local_408._2_2_ = (short)((ulong)uVar10 >> 0x10);
  local_408._4_2_ = (undefined2)((ulong)uVar10 >> 0x20);
  local_408._6_2_ = (undefined2)((ulong)uVar10 >> 0x30);
  auVar255._12_2_ = DAT_01f4bd50._6_2_;
  auVar255._14_2_ = local_408._6_2_;
  auVar254._12_4_ = auVar255._12_4_;
  auVar254._0_10_ = (unkbyte10)DAT_01f4bd50;
  auVar254._10_2_ = local_408._4_2_;
  auVar253._10_6_ = auVar254._10_6_;
  auVar253._0_8_ = (undefined8)DAT_01f4bd50;
  auVar253._8_2_ = DAT_01f4bd50._4_2_;
  auVar252._8_8_ = auVar253._8_8_;
  auVar252._6_2_ = local_408._2_2_;
  auVar252._4_2_ = DAT_01f4bd50._2_2_;
  auVar256._0_4_ = (int)(short)local_408;
  iVar144 = auVar252._4_4_ >> 0x10;
  auVar251._0_8_ = CONCAT44(iVar144,auVar256._0_4_);
  auVar251._8_4_ = auVar253._8_4_ >> 0x10;
  auVar172._12_2_ = (short)((uint)fVar274 >> 0x10);
  auVar172._0_12_ = auVar149;
  auVar172._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar171._12_4_ = auVar172._12_4_;
  auVar171._0_10_ = auVar149._0_10_;
  auVar171._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar170._10_6_ = auVar171._10_6_;
  auVar170._8_2_ = SUB42(fVar274,0);
  auVar170._0_8_ = auVar149._0_8_;
  auVar169._8_8_ = auVar170._8_8_;
  auVar169._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar169._4_2_ = (short)((uint)auVar169._0_4_ >> 0x10);
  auVar173._0_4_ = (float)(int)(short)uVar11;
  fVar316 = (float)(auVar169._4_4_ >> 0x10);
  auVar150._0_8_ = CONCAT44(fVar316,auVar173._0_4_);
  auVar150._8_4_ = (float)(auVar170._8_4_ >> 0x10);
  auVar259._12_2_ = local_408._2_2_ >> 0xf;
  auVar259._0_12_ = auVar251;
  auVar259._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar258._12_4_ = auVar259._12_4_;
  auVar258._0_10_ = auVar251._0_10_;
  auVar258._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar257._10_6_ = auVar258._10_6_;
  auVar257._8_2_ = local_408._2_2_;
  auVar257._0_8_ = auVar251._0_8_;
  auVar256._8_8_ = auVar257._8_8_;
  auVar256._6_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar256._4_2_ = (short)local_408 >> 0xf;
  local_468._0_2_ = (undefined2)uVar13;
  local_468._2_2_ = (undefined2)((ulong)uVar13 >> 0x10);
  local_468._4_2_ = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_462 = (undefined2)((ulong)uVar13 >> 0x30);
  auVar176._12_2_ = (short)((uint)fVar316 >> 0x10);
  auVar176._0_12_ = auVar150;
  auVar176._14_2_ = uStack_462;
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._0_10_ = auVar150._0_10_;
  auVar175._10_2_ = local_468._4_2_;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = SUB42(fVar316,0);
  auVar174._0_8_ = auVar150._0_8_;
  auVar173._8_8_ = auVar174._8_8_;
  auVar173._6_2_ = local_468._2_2_;
  auVar173._4_2_ = (short)((uint)auVar173._0_4_ >> 0x10);
  fVar204 = (float)(auVar173._4_4_ >> 0x10);
  fVar321 = (float)(auVar174._8_4_ >> 0x10);
  uVar197 = (undefined2)(uVar128 >> 0x30);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar128;
  auVar230._12_2_ = uVar197;
  auVar230._14_2_ = uVar197;
  uVar197 = (undefined2)(uVar128 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar128;
  auVar229._10_2_ = uVar197;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar197;
  auVar228._0_8_ = uVar128;
  uVar197 = (undefined2)(uVar128 >> 0x10);
  auVar87._4_8_ = auVar228._8_8_;
  auVar87._2_2_ = uVar197;
  auVar87._0_2_ = uVar197;
  uVar132 = *(ulong *)(prim + uVar125 * 0x14 + 6);
  uVar197 = (undefined2)(uVar132 >> 0x30);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar132;
  auVar179._12_2_ = uVar197;
  auVar179._14_2_ = uVar197;
  uVar197 = (undefined2)(uVar132 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar132;
  auVar178._10_2_ = uVar197;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar197;
  auVar177._0_8_ = uVar132;
  uVar197 = (undefined2)(uVar132 >> 0x10);
  auVar88._4_8_ = auVar177._8_8_;
  auVar88._2_2_ = uVar197;
  auVar88._0_2_ = uVar197;
  fVar275 = (float)(auVar88._0_4_ >> 0x10);
  fVar324 = (float)(auVar177._8_4_ >> 0x10);
  uVar130 = *(ulong *)(prim + uVar125 * 0x18 + 6);
  uVar197 = (undefined2)(uVar130 >> 0x30);
  auVar233._8_4_ = 0;
  auVar233._0_8_ = uVar130;
  auVar233._12_2_ = uVar197;
  auVar233._14_2_ = uVar197;
  uVar197 = (undefined2)(uVar130 >> 0x20);
  auVar232._12_4_ = auVar233._12_4_;
  auVar232._8_2_ = 0;
  auVar232._0_8_ = uVar130;
  auVar232._10_2_ = uVar197;
  auVar231._10_6_ = auVar232._10_6_;
  auVar231._8_2_ = uVar197;
  auVar231._0_8_ = uVar130;
  uVar197 = (undefined2)(uVar130 >> 0x10);
  auVar89._4_8_ = auVar231._8_8_;
  auVar89._2_2_ = uVar197;
  auVar89._0_2_ = uVar197;
  uVar14 = *(ulong *)(prim + uVar125 * 0x1d + 6);
  uVar197 = (undefined2)(uVar14 >> 0x30);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar14;
  auVar182._12_2_ = uVar197;
  auVar182._14_2_ = uVar197;
  uVar197 = (undefined2)(uVar14 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar14;
  auVar181._10_2_ = uVar197;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar197;
  auVar180._0_8_ = uVar14;
  uVar197 = (undefined2)(uVar14 >> 0x10);
  auVar90._4_8_ = auVar180._8_8_;
  auVar90._2_2_ = uVar197;
  auVar90._0_2_ = uVar197;
  fVar318 = (float)(auVar90._0_4_ >> 0x10);
  fVar327 = (float)(auVar180._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar125 * 0x21 + 6);
  uVar197 = (undefined2)(uVar15 >> 0x30);
  auVar236._8_4_ = 0;
  auVar236._0_8_ = uVar15;
  auVar236._12_2_ = uVar197;
  auVar236._14_2_ = uVar197;
  uVar197 = (undefined2)(uVar15 >> 0x20);
  auVar235._12_4_ = auVar236._12_4_;
  auVar235._8_2_ = 0;
  auVar235._0_8_ = uVar15;
  auVar235._10_2_ = uVar197;
  auVar234._10_6_ = auVar235._10_6_;
  auVar234._8_2_ = uVar197;
  auVar234._0_8_ = uVar15;
  uVar197 = (undefined2)(uVar15 >> 0x10);
  auVar91._4_8_ = auVar234._8_8_;
  auVar91._2_2_ = uVar197;
  auVar91._0_2_ = uVar197;
  uVar16 = *(ulong *)(prim + uVar125 * 0x1f + 6);
  uVar197 = (undefined2)(uVar16 >> 0x30);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar16;
  auVar185._12_2_ = uVar197;
  auVar185._14_2_ = uVar197;
  uVar197 = (undefined2)(uVar16 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar16;
  auVar184._10_2_ = uVar197;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar197;
  auVar183._0_8_ = uVar16;
  uVar197 = (undefined2)(uVar16 >> 0x10);
  auVar92._4_8_ = auVar183._8_8_;
  auVar92._2_2_ = uVar197;
  auVar92._0_2_ = uVar197;
  fVar330 = (float)(auVar92._0_4_ >> 0x10);
  fVar339 = (float)(auVar183._8_4_ >> 0x10);
  uVar125 = *(ulong *)(prim + uVar125 * 0x23 + 6);
  uVar197 = (undefined2)(uVar125 >> 0x30);
  auVar239._8_4_ = 0;
  auVar239._0_8_ = uVar125;
  auVar239._12_2_ = uVar197;
  auVar239._14_2_ = uVar197;
  uVar197 = (undefined2)(uVar125 >> 0x20);
  auVar238._12_4_ = auVar239._12_4_;
  auVar238._8_2_ = 0;
  auVar238._0_8_ = uVar125;
  auVar238._10_2_ = uVar197;
  auVar237._10_6_ = auVar238._10_6_;
  auVar237._8_2_ = uVar197;
  auVar237._0_8_ = uVar125;
  uVar197 = (undefined2)(uVar125 >> 0x10);
  auVar93._4_8_ = auVar237._8_8_;
  auVar93._2_2_ = uVar197;
  auVar93._0_2_ = uVar197;
  auVar306._0_8_ =
       CONCAT44(((((float)iVar144 - fVar274) * fVar411 + fVar274) - fVar405) * fStack_3c4,
                ((((float)auVar256._0_4_ - auVar169._0_4_) * fVar411 + auVar169._0_4_) - fVar404) *
                local_3c8);
  auVar306._8_4_ =
       ((((float)auVar251._8_4_ - auVar149._8_4_) * fVar411 + auVar149._8_4_) - fVar407) *
       fStack_3c0;
  auVar306._12_4_ =
       ((((float)(auVar254._12_4_ >> 0x10) - (float)(auVar167._12_4_ >> 0x10)) * fVar411 +
        (float)(auVar167._12_4_ >> 0x10)) - fVar409) * fStack_3bc;
  auVar333._0_4_ =
       ((((float)(int)(short)uVar12 - auVar173._0_4_) * fVar411 + auVar173._0_4_) - fVar404) *
       local_3c8;
  auVar333._4_4_ =
       ((((float)(auVar256._4_4_ >> 0x10) - fVar316) * fVar411 + fVar316) - fVar405) * fStack_3c4;
  auVar333._8_4_ =
       ((((float)(auVar257._8_4_ >> 0x10) - auVar150._8_4_) * fVar411 + auVar150._8_4_) - fVar407) *
       fStack_3c0;
  auVar333._12_4_ =
       ((((float)(auVar258._12_4_ >> 0x10) - (float)(auVar171._12_4_ >> 0x10)) * fVar411 +
        (float)(auVar171._12_4_ >> 0x10)) - fVar409) * fStack_3bc;
  auVar344._0_8_ =
       CONCAT44(((((float)(auVar87._0_4_ >> 0x10) - fVar204) * fVar411 + fVar204) - fVar362) *
                fStack_3d4,
                ((((float)(int)(short)uVar128 - (float)(int)(short)local_468._0_2_) * fVar411 +
                 (float)(int)(short)local_468._0_2_) - fVar367) * local_3d8);
  auVar344._8_4_ =
       ((((float)(auVar228._8_4_ >> 0x10) - fVar321) * fVar411 + fVar321) - fVar363) * fStack_3d0;
  auVar344._12_4_ =
       ((((float)(auVar229._12_4_ >> 0x10) - (float)(auVar175._12_4_ >> 0x10)) * fVar411 +
        (float)(auVar175._12_4_ >> 0x10)) - fVar398) * fStack_3cc;
  auVar360._0_4_ =
       ((((float)(int)(short)uVar130 - (float)(int)(short)uVar132) * fVar411 +
        (float)(int)(short)uVar132) - fVar367) * local_3d8;
  auVar360._4_4_ =
       ((((float)(auVar89._0_4_ >> 0x10) - fVar275) * fVar411 + fVar275) - fVar362) * fStack_3d4;
  auVar360._8_4_ =
       ((((float)(auVar231._8_4_ >> 0x10) - fVar324) * fVar411 + fVar324) - fVar363) * fStack_3d0;
  auVar360._12_4_ =
       ((((float)(auVar232._12_4_ >> 0x10) - (float)(auVar178._12_4_ >> 0x10)) * fVar411 +
        (float)(auVar178._12_4_ >> 0x10)) - fVar398) * fStack_3cc;
  auVar373._0_8_ =
       CONCAT44(((((float)(auVar91._0_4_ >> 0x10) - fVar318) * fVar411 + fVar318) - fVar352) *
                fVar406,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar411 +
                         (float)(int)(short)uVar14) - fVar347) * fVar378);
  auVar373._8_4_ =
       ((((float)(auVar234._8_4_ >> 0x10) - fVar327) * fVar411 + fVar327) - fVar355) * fVar276;
  auVar373._12_4_ =
       ((((float)(auVar235._12_4_ >> 0x10) - (float)(auVar181._12_4_ >> 0x10)) * fVar411 +
        (float)(auVar181._12_4_ >> 0x10)) - fVar359) * fVar341;
  auVar389._0_4_ =
       ((((float)(int)(short)uVar125 - (float)(int)(short)uVar16) * fVar411 +
        (float)(int)(short)uVar16) - fVar347) * fVar378;
  auVar389._4_4_ =
       ((((float)(auVar93._0_4_ >> 0x10) - fVar330) * fVar411 + fVar330) - fVar352) * fVar406;
  auVar389._8_4_ =
       ((((float)(auVar237._8_4_ >> 0x10) - fVar339) * fVar411 + fVar339) - fVar355) * fVar276;
  auVar389._12_4_ =
       ((((float)(auVar238._12_4_ >> 0x10) - (float)(auVar184._12_4_ >> 0x10)) * fVar411 +
        (float)(auVar184._12_4_ >> 0x10)) - fVar359) * fVar341;
  auVar240._8_4_ = auVar306._8_4_;
  auVar240._0_8_ = auVar306._0_8_;
  auVar240._12_4_ = auVar306._12_4_;
  auVar241 = minps(auVar240,auVar333);
  auVar186._8_4_ = auVar344._8_4_;
  auVar186._0_8_ = auVar344._0_8_;
  auVar186._12_4_ = auVar344._12_4_;
  auVar164 = minps(auVar186,auVar360);
  auVar241 = maxps(auVar241,auVar164);
  auVar187._8_4_ = auVar373._8_4_;
  auVar187._0_8_ = auVar373._0_8_;
  auVar187._12_4_ = auVar373._12_4_;
  auVar164 = minps(auVar187,auVar389);
  uVar131 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar207._4_4_ = uVar131;
  auVar207._0_4_ = uVar131;
  auVar207._8_4_ = uVar131;
  auVar207._12_4_ = uVar131;
  auVar164 = maxps(auVar164,auVar207);
  auVar164 = maxps(auVar241,auVar164);
  fVar274 = auVar164._0_4_ * 0.99999964;
  fVar316 = auVar164._4_4_ * 0.99999964;
  fVar204 = auVar164._8_4_ * 0.99999964;
  fVar275 = auVar164._12_4_ * 0.99999964;
  auVar164 = maxps(auVar306,auVar333);
  auVar241 = maxps(auVar344,auVar360);
  auVar164 = minps(auVar164,auVar241);
  auVar241 = maxps(auVar373,auVar389);
  fVar406 = (ray->super_RayK<1>).tfar;
  auVar208._4_4_ = fVar406;
  auVar208._0_4_ = fVar406;
  auVar208._8_4_ = fVar406;
  auVar208._12_4_ = fVar406;
  auVar241 = minps(auVar241,auVar208);
  auVar164 = minps(auVar164,auVar241);
  auVar209._0_4_ = -(uint)(PVar17 != (Primitive)0x0 && fVar274 <= auVar164._0_4_ * 1.0000004);
  auVar209._4_4_ = -(uint)(1 < (byte)PVar17 && fVar316 <= auVar164._4_4_ * 1.0000004);
  auVar209._8_4_ = -(uint)(2 < (byte)PVar17 && fVar204 <= auVar164._8_4_ * 1.0000004);
  auVar209._12_4_ = -(uint)(3 < (byte)PVar17 && fVar275 <= auVar164._12_4_ * 1.0000004);
  uVar131 = movmskps((int)unaff_RBP,auVar209);
  uVar132 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar131);
  local_408 = uVar10;
  _local_3f8 = auVar308;
  local_210 = ray;
  do {
    if (uVar132 == 0) {
      return;
    }
    lVar134 = 0;
    if (uVar132 != 0) {
      for (; (uVar132 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
      }
    }
    local_390 = (RTCIntersectArguments *)(ulong)*(uint *)(prim + 2);
    local_360 = (ulong)*(uint *)(prim + lVar134 * 4 + 6);
    pGVar25 = (context->scene->geometries).items[(long)local_390].ptr;
    uVar128 = (ulong)*(uint *)(*(long *)&pGVar25->field_0x58 +
                              local_360 *
                              pGVar25[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar406 = pGVar25->fnumTimeSegments;
    fVar318 = (pGVar25->time_range).lower;
    fVar330 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar318) /
              ((pGVar25->time_range).upper - fVar318)) * fVar406;
    fVar318 = floorf(fVar330);
    fVar406 = fVar406 + -1.0;
    if (fVar406 <= fVar318) {
      fVar318 = fVar406;
    }
    fVar406 = 0.0;
    if (0.0 <= fVar318) {
      fVar406 = fVar318;
    }
    _Var26 = pGVar25[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar126 = (long)(int)fVar406 * 0x38;
    lVar133 = *(long *)(_Var26 + 0x10 + lVar126);
    lVar135 = *(long *)(_Var26 + 0x38 + lVar126);
    lVar136 = *(long *)(_Var26 + 0x48 + lVar126);
    pfVar1 = (float *)(lVar135 + lVar136 * uVar128);
    lVar134 = uVar128 + 1;
    pfVar2 = (float *)(lVar135 + lVar136 * lVar134);
    p_Var27 = pGVar25[4].occlusionFilterN;
    pfVar3 = (float *)(*(long *)(_Var26 + lVar126) + lVar133 * uVar128);
    pfVar4 = (float *)(*(long *)(_Var26 + lVar126) + lVar133 * lVar134);
    uVar130 = *(ulong *)(p_Var27 + lVar126 + 0x38);
    pRVar129 = (RTCIntersectArguments *)(*(long *)(p_Var27 + lVar126 + 0x10) * lVar134);
    pfVar5 = (float *)(uVar130 + uVar128 * *(long *)(p_Var27 + lVar126 + 0x48));
    pfVar6 = (float *)(*(long *)(p_Var27 + lVar126) + *(long *)(p_Var27 + lVar126 + 0x10) * uVar128)
    ;
    fVar330 = fVar330 - fVar406;
    fVar406 = 1.0 - fVar330;
    local_338 = *pfVar3 * fVar406 + *pfVar1 * fVar330;
    fStack_334 = pfVar3[1] * fVar406 + pfVar1[1] * fVar330;
    fStack_330 = pfVar3[2] * fVar406 + pfVar1[2] * fVar330;
    fVar398 = pfVar3[3] * fVar406 + pfVar1[3] * fVar330;
    pfVar1 = (float *)(uVar130 + *(long *)(p_Var27 + lVar126 + 0x48) * lVar134);
    pfVar3 = (float *)((long)&pRVar129->flags + *(long *)(p_Var27 + lVar126));
    fVar404 = *pfVar4 * fVar406 + *pfVar2 * fVar330;
    fVar405 = pfVar4[1] * fVar406 + pfVar2[1] * fVar330;
    fVar407 = pfVar4[2] * fVar406 + pfVar2[2] * fVar330;
    fVar409 = pfVar4[3] * fVar406 + pfVar2[3] * fVar330;
    fVar411 = (*pfVar6 * fVar406 + *pfVar5 * fVar330) * 0.33333334 + local_338;
    fVar420 = (pfVar6[1] * fVar406 + pfVar5[1] * fVar330) * 0.33333334 + fStack_334;
    fVar426 = (pfVar6[2] * fVar406 + pfVar5[2] * fVar330) * 0.33333334 + fStack_330;
    fVar427 = (pfVar6[3] * fVar406 + pfVar5[3] * fVar330) * 0.33333334 + fVar398;
    fVar431 = fVar404 - (fVar406 * *pfVar3 + fVar330 * *pfVar1) * 0.33333334;
    fVar434 = fVar405 - (fVar406 * pfVar3[1] + fVar330 * pfVar1[1]) * 0.33333334;
    fVar408 = fVar407 - (fVar406 * pfVar3[2] + fVar330 * pfVar1[2]) * 0.33333334;
    fVar410 = fVar409 - (fVar406 * pfVar3[3] + fVar330 * pfVar1[3]) * 0.33333334;
    fVar406 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar318 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar330 = (ray->super_RayK<1>).org.field_0.m128[2];
    local_1d8 = (ray->super_RayK<1>).org.field_0.m128[3];
    fStack_32c = fVar398;
    fVar359 = local_338 - fVar406;
    fVar367 = fStack_334 - fVar318;
    fVar362 = fStack_330 - fVar330;
    fVar276 = (pre->ray_space).vx.field_0.m128[0];
    fVar321 = (pre->ray_space).vx.field_0.m128[1];
    fVar324 = (pre->ray_space).vx.field_0.m128[2];
    fVar327 = (pre->ray_space).vy.field_0.m128[0];
    fVar339 = (pre->ray_space).vy.field_0.m128[1];
    fVar341 = (pre->ray_space).vy.field_0.m128[2];
    fVar347 = (pre->ray_space).vz.field_0.m128[0];
    fVar352 = (pre->ray_space).vz.field_0.m128[1];
    fVar355 = (pre->ray_space).vz.field_0.m128[2];
    fVar378 = fVar359 * fVar276 + fVar367 * fVar327 + fVar362 * fVar347;
    local_178 = fVar359 * fVar321 + fVar367 * fVar339 + fVar362 * fVar352;
    fVar393 = fVar359 * fVar324 + fVar367 * fVar341 + fVar362 * fVar355;
    fVar359 = fVar411 - fVar406;
    fVar367 = fVar420 - fVar318;
    fVar362 = fVar426 - fVar330;
    local_1e8 = fVar359 * fVar276 + fVar367 * fVar327 + fVar362 * fVar347;
    fVar386 = fVar359 * fVar321 + fVar367 * fVar339 + fVar362 * fVar352;
    fVar396 = fVar359 * fVar324 + fVar367 * fVar341 + fVar362 * fVar355;
    fVar367 = fVar431 - fVar406;
    fVar362 = fVar434 - fVar318;
    fVar363 = fVar408 - fVar330;
    fVar359 = fVar367 * fVar276 + fVar362 * fVar327 + fVar363 * fVar347;
    local_418 = fVar367 * fVar321 + fVar362 * fVar339 + fVar363 * fVar352;
    local_1c8 = fVar367 * fVar324 + fVar362 * fVar341 + fVar363 * fVar355;
    fVar406 = fVar404 - fVar406;
    fVar318 = fVar405 - fVar318;
    fVar330 = fVar407 - fVar330;
    iVar144 = (int)pGVar25[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    local_3a8 = fVar406 * fVar276 + fVar318 * fVar327 + fVar330 * fVar347;
    local_428 = fVar406 * fVar321 + fVar318 * fVar339 + fVar330 * fVar352;
    fVar318 = fVar406 * fVar324 + fVar318 * fVar341 + fVar330 * fVar355;
    auVar374._0_8_ = CONCAT44(local_178,fVar378) & 0x7fffffff7fffffff;
    auVar374._8_4_ = ABS(fVar393);
    auVar374._12_4_ = ABS(fVar398);
    auVar260._0_8_ = CONCAT44(fVar386,local_1e8) & 0x7fffffff7fffffff;
    auVar260._8_4_ = ABS(fVar396);
    auVar260._12_4_ = ABS(fVar427);
    auVar164 = maxps(auVar374,auVar260);
    auVar307._0_8_ = CONCAT44(local_418,fVar359) & 0x7fffffff7fffffff;
    auVar307._8_4_ = ABS(local_1c8);
    auVar307._12_4_ = ABS(fVar410);
    auVar210._0_8_ = CONCAT44(local_428,local_3a8) & 0x7fffffff7fffffff;
    auVar210._8_4_ = ABS(fVar318);
    auVar210._12_4_ = ABS(fVar409);
    auVar308 = maxps(auVar307,auVar210);
    auVar308 = maxps(auVar164,auVar308);
    fStack_204 = auVar308._4_4_;
    fVar406 = fStack_204;
    if (fStack_204 <= auVar308._0_4_) {
      fVar406 = auVar308._0_4_;
    }
    auVar375._8_8_ = auVar308._8_8_;
    auVar375._0_8_ = auVar308._8_8_;
    if (auVar308._8_4_ <= fVar406) {
      auVar375._0_4_ = fVar406;
    }
    local_208 = (float)iVar144;
    fStack_200 = fStack_204;
    fStack_1fc = fStack_204;
    local_3e8._4_4_ = -(uint)(1.0 < local_208);
    local_3e8._0_4_ = -(uint)(0.0 < local_208);
    iStack_3e0 = -(uint)(2.0 < local_208);
    iStack_3dc = -(uint)(3.0 < local_208);
    lVar134 = (long)iVar144;
    lVar133 = lVar134 * 0x44;
    local_408 = CONCAT44(fVar359,fVar359);
    fStack_400 = fVar359;
    fStack_3fc = fVar359;
    pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar133 + 0xd8c);
    fVar406 = *(float *)*pauVar8;
    fVar330 = *(float *)(bezier_basis0 + lVar133 + 0xd90);
    fVar276 = *(float *)(bezier_basis0 + lVar133 + 0xd94);
    auVar72 = *(undefined1 (*) [12])*pauVar8;
    fVar321 = *(float *)(bezier_basis0 + lVar133 + 0xd98);
    _local_358 = *pauVar8;
    fStack_3a4 = local_3a8;
    fStack_3a0 = local_3a8;
    fStack_39c = local_3a8;
    fVar324 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar133 + 0x908);
    fVar327 = *(float *)(bezier_basis0 + lVar133 + 0x90c);
    fVar339 = *(float *)(bezier_basis0 + lVar133 + 0x910);
    auVar75 = *(undefined1 (*) [12])(bezier_basis0 + lVar133 + 0x908);
    fVar341 = *(float *)(bezier_basis0 + lVar133 + 0x914);
    fStack_1e4 = local_1e8;
    fStack_1e0 = local_1e8;
    fStack_1dc = local_1e8;
    pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar133 + 0x484);
    fVar347 = *(float *)*pauVar8;
    fVar352 = *(float *)(bezier_basis0 + lVar133 + 0x488);
    fVar355 = *(float *)(bezier_basis0 + lVar133 + 0x48c);
    auVar77 = *(undefined1 (*) [12])*pauVar8;
    fVar367 = *(float *)(bezier_basis0 + lVar133 + 0x490);
    _local_378 = *pauVar8;
    fVar362 = *(float *)(bezier_basis0 + lVar133);
    fVar363 = *(float *)(bezier_basis0 + lVar133 + 4);
    fVar356 = *(float *)(bezier_basis0 + lVar133 + 8);
    fVar357 = *(float *)(bezier_basis0 + lVar133 + 0xc);
    local_188 = fVar378 * fVar362 + local_1e8 * fVar347 + fVar359 * fVar324 + local_3a8 * fVar406;
    fStack_184 = fVar378 * fVar363 + local_1e8 * fVar352 + fVar359 * fVar327 + local_3a8 * fVar330;
    fStack_180 = fVar378 * fVar356 + local_1e8 * fVar355 + fVar359 * fVar339 + local_3a8 * fVar276;
    fStack_17c = fVar378 * fVar357 + local_1e8 * fVar367 + fVar359 * fVar341 + local_3a8 * fVar321;
    local_348 = local_178 * fVar362 + fVar386 * fVar347 + local_418 * fVar324 + local_428 * fVar406;
    fStack_344 = local_178 * fVar363 + fVar386 * fVar352 + local_418 * fVar327 + local_428 * fVar330
    ;
    fStack_340 = local_178 * fVar356 + fVar386 * fVar355 + local_418 * fVar339 + local_428 * fVar276
    ;
    fStack_33c = local_178 * fVar357 + fVar386 * fVar367 + local_418 * fVar341 + local_428 * fVar321
    ;
    fVar331 = fVar398 * fVar362 + fVar427 * fVar347 + fVar410 * fVar324 + fVar409 * fVar406;
    fVar340 = fVar398 * fVar363 + fVar427 * fVar352 + fVar410 * fVar327 + fVar409 * fVar330;
    auVar334._0_8_ = CONCAT44(fVar340,fVar331);
    auVar334._8_4_ = fVar398 * fVar356 + fVar427 * fVar355 + fVar410 * fVar339 + fVar409 * fVar276;
    auVar334._12_4_ = fVar398 * fVar357 + fVar427 * fVar367 + fVar410 * fVar341 + fVar409 * fVar321;
    fVar406 = *(float *)*(undefined1 (*) [12])(bezier_basis1 + lVar133 + 0xd8c);
    fVar330 = *(float *)(bezier_basis1 + lVar133 + 0xd90);
    fVar276 = *(float *)(bezier_basis1 + lVar133 + 0xd94);
    auVar79 = *(undefined1 (*) [12])(bezier_basis1 + lVar133 + 0xd8c);
    fVar324 = *(float *)(bezier_basis1 + lVar133 + 0xd98);
    fVar327 = *(float *)(bezier_basis1 + lVar133 + 0x908);
    fVar339 = *(float *)(bezier_basis1 + lVar133 + 0x90c);
    fVar347 = *(float *)(bezier_basis1 + lVar133 + 0x910);
    fVar352 = *(float *)(bezier_basis1 + lVar133 + 0x914);
    fStack_424 = local_428;
    fStack_420 = local_428;
    fStack_41c = local_428;
    fStack_414 = local_418;
    fStack_410 = local_418;
    fStack_40c = local_418;
    fVar355 = *(float *)(bezier_basis1 + lVar133 + 0x484);
    fVar358 = *(float *)(bezier_basis1 + lVar133 + 0x488);
    fVar364 = *(float *)(bezier_basis1 + lVar133 + 0x48c);
    fVar365 = *(float *)(bezier_basis1 + lVar133 + 0x490);
    fVar387 = *(float *)(bezier_basis1 + lVar133);
    fVar394 = *(float *)(bezier_basis1 + lVar133 + 4);
    fVar422 = *(float *)(bezier_basis1 + lVar133 + 8);
    fVar429 = *(float *)(bezier_basis1 + lVar133 + 0xc);
    local_1f8._0_4_ =
         fVar378 * fVar387 + local_1e8 * fVar355 + fVar359 * fVar327 + local_3a8 * fVar406;
    local_1f8._4_4_ =
         fVar378 * fVar394 + local_1e8 * fVar358 + fVar359 * fVar339 + local_3a8 * fVar330;
    fStack_1f0 = fVar378 * fVar422 + local_1e8 * fVar364 + fVar359 * fVar347 + local_3a8 * fVar276;
    fStack_1ec = fVar378 * fVar429 + local_1e8 * fVar365 + fVar359 * fVar352 + local_3a8 * fVar324;
    fStack_174 = local_178;
    fStack_170 = local_178;
    fStack_16c = local_178;
    fVar342 = local_178 * fVar387 + fVar386 * fVar355 + local_418 * fVar327 + local_428 * fVar406;
    fVar348 = local_178 * fVar394 + fVar386 * fVar358 + local_418 * fVar339 + local_428 * fVar330;
    fStack_3b0 = local_178 * fVar422 + fVar386 * fVar364 + local_418 * fVar347 + local_428 * fVar276
    ;
    fStack_3ac = local_178 * fVar429 + fVar386 * fVar365 + local_418 * fVar352 + local_428 * fVar324
    ;
    auVar376._0_4_ = fVar398 * fVar387 + fVar427 * fVar355 + fVar410 * fVar327 + fVar409 * fVar406;
    auVar376._4_4_ = fVar398 * fVar394 + fVar427 * fVar358 + fVar410 * fVar339 + fVar409 * fVar330;
    auVar376._8_4_ = fVar398 * fVar422 + fVar427 * fVar364 + fVar410 * fVar347 + fVar409 * fVar276;
    auVar376._12_4_ = fVar398 * fVar429 + fVar427 * fVar365 + fVar410 * fVar352 + fVar409 * fVar324;
    fVar277 = (float)local_1f8._0_4_ - local_188;
    fVar322 = (float)local_1f8._4_4_ - fStack_184;
    fVar325 = fStack_1f0 - fStack_180;
    fVar328 = fStack_1ec - fStack_17c;
    local_3b8 = CONCAT44(fVar348,fVar342);
    fVar343 = fVar342 - local_348;
    fVar349 = fVar348 - fStack_344;
    fVar350 = fStack_3b0 - fStack_340;
    fVar351 = fStack_3ac - fStack_33c;
    fVar406 = local_348 * fVar277 - local_188 * fVar343;
    fVar330 = fStack_344 * fVar322 - fStack_184 * fVar349;
    fVar276 = fStack_340 * fVar325 - fStack_180 * fVar350;
    fVar435 = fStack_33c * fVar328 - fStack_17c * fVar351;
    auVar353._8_4_ = auVar334._8_4_;
    auVar353._0_8_ = auVar334._0_8_;
    auVar353._12_4_ = auVar334._12_4_;
    auVar308 = maxps(auVar353,auVar376);
    bVar30 = fVar406 * fVar406 <=
             auVar308._0_4_ * auVar308._0_4_ * (fVar277 * fVar277 + fVar343 * fVar343) &&
             0.0 < local_208;
    auVar425._0_4_ = -(uint)bVar30;
    bVar97 = fVar330 * fVar330 <=
             auVar308._4_4_ * auVar308._4_4_ * (fVar322 * fVar322 + fVar349 * fVar349) &&
             1.0 < local_208;
    auVar425._4_4_ = -(uint)bVar97;
    bVar29 = fVar276 * fVar276 <=
             auVar308._8_4_ * auVar308._8_4_ * (fVar325 * fVar325 + fVar350 * fVar350) &&
             2.0 < local_208;
    auVar425._8_4_ = -(uint)bVar29;
    bVar28 = fVar435 * fVar435 <=
             auVar308._12_4_ * auVar308._12_4_ * (fVar328 * fVar328 + fVar351 * fVar351) &&
             3.0 < local_208;
    auVar425._12_4_ = -(uint)bVar28;
    local_3f8._0_4_ = auVar375._0_4_;
    stack0xfffffffffffffc0c = auVar375._4_4_;
    fStack_3f0 = auVar375._8_4_;
    fStack_3ec = auVar375._12_4_;
    fVar406 = (float)local_3f8._0_4_ * 4.7683716e-07;
    local_3f8._0_4_ = fVar406;
    uVar131 = SUB84(pre,0);
    iVar199 = movmskps(uVar131,auVar425);
    fStack_1d4 = local_1d8;
    fStack_1d0 = local_1d8;
    fStack_1cc = local_1d8;
    fStack_1c4 = local_1c8;
    fStack_1c0 = local_1c8;
    fStack_1bc = local_1c8;
    fVar435 = fVar359;
    fVar330 = fVar359;
    fVar276 = fVar359;
    if (iVar199 != 0) {
      local_1a8 = fVar343;
      fStack_1a4 = fVar349;
      fStack_1a0 = fVar350;
      fStack_19c = fVar351;
      local_468._0_4_ = auVar79._0_4_;
      stack0xfffffffffffffb9c = auVar79._4_4_;
      fStack_460 = auVar79._8_4_;
      fVar145 = (float)local_468._0_4_ * fVar318 + fVar327 * local_1c8 + fVar355 * fVar396 +
                fVar387 * fVar393;
      fVar202 = stack0xfffffffffffffb9c * fVar318 + fVar339 * local_1c8 + fVar358 * fVar396 +
                fVar394 * fVar393;
      fVar205 = fStack_460 * fVar318 + fVar347 * local_1c8 + fVar364 * fVar396 + fVar422 * fVar393;
      fVar206 = fVar324 * fVar318 + fVar352 * local_1c8 + fVar365 * fVar396 + fVar429 * fVar393;
      local_378._0_4_ = auVar77._0_4_;
      local_378._4_4_ = auVar77._4_4_;
      fStack_370 = auVar77._8_4_;
      local_268 = auVar75._0_4_;
      fStack_264 = auVar75._4_4_;
      fStack_260 = auVar75._8_4_;
      local_358._0_4_ = auVar72._0_4_;
      local_358._4_4_ = auVar72._4_4_;
      fStack_350 = auVar72._8_4_;
      fVar250 = (float)local_358._0_4_ * fVar318 + local_268 * local_1c8 +
                (float)local_378._0_4_ * fVar396 + fVar362 * fVar393;
      fVar271 = (float)local_358._4_4_ * fVar318 + fStack_264 * local_1c8 +
                (float)local_378._4_4_ * fVar396 + fVar363 * fVar393;
      fVar272 = fStack_350 * fVar318 + fStack_260 * local_1c8 + fStack_370 * fVar396 +
                fVar356 * fVar393;
      fVar273 = fVar321 * fVar318 + fVar341 * local_1c8 + fVar367 * fVar396 + fVar357 * fVar393;
      fVar321 = *(float *)(bezier_basis0 + lVar133 + 0x1210);
      fVar324 = *(float *)(bezier_basis0 + lVar133 + 0x1214);
      fVar327 = *(float *)(bezier_basis0 + lVar133 + 0x1218);
      fVar339 = *(float *)(bezier_basis0 + lVar133 + 0x121c);
      fVar341 = *(float *)(bezier_basis0 + lVar133 + 0x1694);
      fVar347 = *(float *)(bezier_basis0 + lVar133 + 0x1698);
      fVar352 = *(float *)(bezier_basis0 + lVar133 + 0x169c);
      fVar355 = *(float *)(bezier_basis0 + lVar133 + 0x16a0);
      fVar367 = *(float *)(bezier_basis0 + lVar133 + 0x1b18);
      fVar362 = *(float *)(bezier_basis0 + lVar133 + 0x1b1c);
      fVar363 = *(float *)(bezier_basis0 + lVar133 + 0x1b20);
      fVar356 = *(float *)(bezier_basis0 + lVar133 + 0x1b24);
      fVar357 = *(float *)(bezier_basis0 + lVar133 + 0x1f9c);
      fVar358 = *(float *)(bezier_basis0 + lVar133 + 0x1fa0);
      fVar364 = *(float *)(bezier_basis0 + lVar133 + 0x1fa4);
      fVar365 = *(float *)(bezier_basis0 + lVar133 + 0x1fa8);
      _local_3e8 = auVar376;
      _local_358 = auVar334;
      fVar371 = fVar378 * fVar321 + local_1e8 * fVar341 + fVar359 * fVar367 + local_3a8 * fVar357;
      fVar379 = fVar378 * fVar324 + local_1e8 * fVar347 + fVar359 * fVar362 + local_3a8 * fVar358;
      fVar382 = fVar378 * fVar327 + local_1e8 * fVar352 + fVar359 * fVar363 + local_3a8 * fVar364;
      fVar384 = fVar378 * fVar339 + local_1e8 * fVar355 + fVar359 * fVar356 + local_3a8 * fVar365;
      fVar421 = local_178 * fVar321 + fVar386 * fVar341 + local_418 * fVar367 + local_428 * fVar357;
      fVar428 = local_178 * fVar324 + fVar386 * fVar347 + local_418 * fVar362 + local_428 * fVar358;
      fVar432 = local_178 * fVar327 + fVar386 * fVar352 + local_418 * fVar363 + local_428 * fVar364;
      fVar436 = local_178 * fVar339 + fVar386 * fVar355 + local_418 * fVar356 + local_428 * fVar365;
      fVar387 = *(float *)(bezier_basis1 + lVar133 + 0x1210);
      fVar394 = *(float *)(bezier_basis1 + lVar133 + 0x1214);
      fVar422 = *(float *)(bezier_basis1 + lVar133 + 0x1218);
      fVar429 = *(float *)(bezier_basis1 + lVar133 + 0x121c);
      fVar381 = *(float *)(bezier_basis1 + lVar133 + 0x1b18);
      fVar366 = *(float *)(bezier_basis1 + lVar133 + 0x1b1c);
      fVar368 = *(float *)(bezier_basis1 + lVar133 + 0x1b20);
      fVar369 = *(float *)(bezier_basis1 + lVar133 + 0x1b24);
      fVar370 = *(float *)(bezier_basis1 + lVar133 + 0x1f9c);
      fVar372 = *(float *)(bezier_basis1 + lVar133 + 0x1fa0);
      fVar380 = *(float *)(bezier_basis1 + lVar133 + 0x1fa4);
      fVar383 = *(float *)(bezier_basis1 + lVar133 + 0x1fa8);
      fVar385 = *(float *)(bezier_basis1 + lVar133 + 0x1694);
      fVar388 = *(float *)(bezier_basis1 + lVar133 + 0x1698);
      fVar395 = *(float *)(bezier_basis1 + lVar133 + 0x169c);
      fVar397 = *(float *)(bezier_basis1 + lVar133 + 0x16a0);
      fVar412 = fVar378 * fVar387 + local_1e8 * fVar385 + fVar359 * fVar381 + local_3a8 * fVar370;
      fVar416 = fVar378 * fVar394 + local_1e8 * fVar388 + fVar359 * fVar366 + local_3a8 * fVar372;
      fVar417 = fVar378 * fVar422 + local_1e8 * fVar395 + fVar359 * fVar368 + local_3a8 * fVar380;
      fVar418 = fVar378 * fVar429 + local_1e8 * fVar397 + fVar359 * fVar369 + local_3a8 * fVar383;
      fVar278 = local_178 * fVar387 + fVar386 * fVar385 + local_418 * fVar381 + local_428 * fVar370;
      fVar323 = local_178 * fVar394 + fVar386 * fVar388 + local_418 * fVar366 + local_428 * fVar372;
      fVar326 = local_178 * fVar422 + fVar386 * fVar395 + local_418 * fVar368 + local_428 * fVar380;
      fVar329 = local_178 * fVar429 + fVar386 * fVar397 + local_418 * fVar369 + local_428 * fVar383;
      auVar390._0_8_ = CONCAT44(fVar379,fVar371) & 0x7fffffff7fffffff;
      auVar390._8_4_ = ABS(fVar382);
      auVar390._12_4_ = ABS(fVar384);
      auVar354._0_8_ = CONCAT44(fVar428,fVar421) & 0x7fffffff7fffffff;
      auVar354._8_4_ = ABS(fVar432);
      auVar354._12_4_ = ABS(fVar436);
      auVar308 = maxps(auVar390,auVar354);
      auVar399._0_8_ =
           CONCAT44(fVar324 * fVar393 + fVar347 * fVar396 + fVar362 * local_1c8 + fVar358 * fVar318,
                    fVar321 * fVar393 + fVar341 * fVar396 + fVar367 * local_1c8 + fVar357 * fVar318)
           & 0x7fffffff7fffffff;
      auVar399._8_4_ =
           ABS(fVar327 * fVar393 + fVar352 * fVar396 + fVar363 * local_1c8 + fVar364 * fVar318);
      auVar399._12_4_ =
           ABS(fVar339 * fVar393 + fVar355 * fVar396 + fVar356 * local_1c8 + fVar365 * fVar318);
      auVar308 = maxps(auVar308,auVar399);
      uVar137 = -(uint)(fVar406 <= auVar308._0_4_);
      uVar138 = -(uint)(fVar406 <= auVar308._4_4_);
      uVar139 = -(uint)(fVar406 <= auVar308._8_4_);
      uVar140 = -(uint)(fVar406 <= auVar308._12_4_);
      fVar347 = (float)((uint)fVar371 & uVar137 | ~uVar137 & (uint)fVar277);
      fVar355 = (float)((uint)fVar379 & uVar138 | ~uVar138 & (uint)fVar322);
      fVar367 = (float)((uint)fVar382 & uVar139 | ~uVar139 & (uint)fVar325);
      fVar362 = (float)((uint)fVar384 & uVar140 | ~uVar140 & (uint)fVar328);
      fVar363 = (float)(~uVar137 & (uint)fVar343 | (uint)fVar421 & uVar137);
      fVar356 = (float)(~uVar138 & (uint)fVar349 | (uint)fVar428 & uVar138);
      fVar357 = (float)(~uVar139 & (uint)fVar350 | (uint)fVar432 & uVar139);
      fVar358 = (float)(~uVar140 & (uint)fVar351 | (uint)fVar436 & uVar140);
      auVar400._0_8_ = CONCAT44(fVar416,fVar412) & 0x7fffffff7fffffff;
      auVar400._8_4_ = ABS(fVar417);
      auVar400._12_4_ = ABS(fVar418);
      auVar361._0_8_ = CONCAT44(fVar323,fVar278) & 0x7fffffff7fffffff;
      auVar361._8_4_ = ABS(fVar326);
      auVar361._12_4_ = ABS(fVar329);
      auVar308 = maxps(auVar400,auVar361);
      auVar345._0_8_ =
           CONCAT44(fVar394 * fVar393 + fVar388 * fVar396 + fVar366 * local_1c8 + fVar372 * fVar318,
                    fVar387 * fVar393 + fVar385 * fVar396 + fVar381 * local_1c8 + fVar370 * fVar318)
           & 0x7fffffff7fffffff;
      auVar345._8_4_ =
           ABS(fVar422 * fVar393 + fVar395 * fVar396 + fVar368 * local_1c8 + fVar380 * fVar318);
      auVar345._12_4_ =
           ABS(fVar429 * fVar393 + fVar397 * fVar396 + fVar369 * local_1c8 + fVar383 * fVar318);
      auVar308 = maxps(auVar308,auVar345);
      uVar137 = -(uint)(fVar406 <= auVar308._0_4_);
      uVar138 = -(uint)(fVar406 <= auVar308._4_4_);
      uVar139 = -(uint)(fVar406 <= auVar308._8_4_);
      uVar140 = -(uint)(fVar406 <= auVar308._12_4_);
      fVar381 = (float)((uint)fVar412 & uVar137 | ~uVar137 & (uint)fVar277);
      fVar372 = (float)((uint)fVar416 & uVar138 | ~uVar138 & (uint)fVar322);
      fVar380 = (float)((uint)fVar417 & uVar139 | ~uVar139 & (uint)fVar325);
      fVar383 = (float)((uint)fVar418 & uVar140 | ~uVar140 & (uint)fVar328);
      auVar309._0_4_ = (uint)fVar278 & uVar137;
      auVar309._4_4_ = (uint)fVar323 & uVar138;
      auVar309._8_4_ = (uint)fVar326 & uVar139;
      auVar309._12_4_ = (uint)fVar329 & uVar140;
      auVar401._0_4_ = ~uVar137 & (uint)fVar343;
      auVar401._4_4_ = ~uVar138 & (uint)fVar349;
      auVar401._8_4_ = ~uVar139 & (uint)fVar350;
      auVar401._12_4_ = ~uVar140 & (uint)fVar351;
      auVar401 = auVar401 | auVar309;
      auVar211._0_4_ = fVar363 * fVar363 + fVar347 * fVar347;
      auVar211._4_4_ = fVar356 * fVar356 + fVar355 * fVar355;
      auVar211._8_4_ = fVar357 * fVar357 + fVar367 * fVar367;
      auVar211._12_4_ = fVar358 * fVar358 + fVar362 * fVar362;
      auVar308 = rsqrtps(auVar309,auVar211);
      fVar321 = auVar308._0_4_;
      fVar324 = auVar308._4_4_;
      fVar327 = auVar308._8_4_;
      fVar339 = auVar308._12_4_;
      auVar310._0_4_ = fVar321 * fVar321 * auVar211._0_4_ * 0.5 * fVar321;
      auVar310._4_4_ = fVar324 * fVar324 * auVar211._4_4_ * 0.5 * fVar324;
      auVar310._8_4_ = fVar327 * fVar327 * auVar211._8_4_ * 0.5 * fVar327;
      auVar310._12_4_ = fVar339 * fVar339 * auVar211._12_4_ * 0.5 * fVar339;
      fVar422 = fVar321 * 1.5 - auVar310._0_4_;
      fVar429 = fVar324 * 1.5 - auVar310._4_4_;
      fVar343 = fVar327 * 1.5 - auVar310._8_4_;
      fVar349 = fVar339 * 1.5 - auVar310._12_4_;
      fVar364 = auVar401._0_4_;
      fVar365 = auVar401._4_4_;
      fVar325 = auVar401._8_4_;
      fVar328 = auVar401._12_4_;
      auVar212._0_4_ = fVar364 * fVar364 + fVar381 * fVar381;
      auVar212._4_4_ = fVar365 * fVar365 + fVar372 * fVar372;
      auVar212._8_4_ = fVar325 * fVar325 + fVar380 * fVar380;
      auVar212._12_4_ = fVar328 * fVar328 + fVar383 * fVar383;
      auVar308 = rsqrtps(auVar310,auVar212);
      fVar321 = auVar308._0_4_;
      fVar324 = auVar308._4_4_;
      fVar327 = auVar308._8_4_;
      fVar339 = auVar308._12_4_;
      fVar321 = fVar321 * 1.5 - fVar321 * fVar321 * auVar212._0_4_ * 0.5 * fVar321;
      fVar341 = fVar324 * 1.5 - fVar324 * fVar324 * auVar212._4_4_ * 0.5 * fVar324;
      fVar327 = fVar327 * 1.5 - fVar327 * fVar327 * auVar212._8_4_ * 0.5 * fVar327;
      fVar352 = fVar339 * 1.5 - fVar339 * fVar339 * auVar212._12_4_ * 0.5 * fVar339;
      fVar387 = fVar363 * fVar422 * fVar331;
      fVar394 = fVar356 * fVar429 * fVar340;
      fVar277 = fVar357 * fVar343 * auVar334._8_4_;
      fVar322 = fVar358 * fVar349 * auVar334._12_4_;
      fVar324 = -fVar347 * fVar422 * fVar331;
      fVar339 = -fVar355 * fVar429 * fVar340;
      fVar347 = -fVar367 * fVar343 * auVar334._8_4_;
      fVar355 = -fVar362 * fVar349 * auVar334._12_4_;
      fVar323 = fVar422 * 0.0 * fVar331;
      fVar326 = fVar429 * 0.0 * fVar340;
      fVar329 = fVar343 * 0.0 * auVar334._8_4_;
      fVar371 = fVar349 * 0.0 * auVar334._12_4_;
      local_378._0_4_ = fVar250 + fVar323;
      local_378._4_4_ = fVar271 + fVar326;
      fStack_370 = fVar272 + fVar329;
      fStack_36c = fVar273 + fVar371;
      fVar422 = fVar364 * fVar321 * auVar376._0_4_;
      fVar429 = fVar365 * fVar341 * auVar376._4_4_;
      fVar349 = fVar325 * fVar327 * auVar376._8_4_;
      fVar350 = fVar328 * fVar352 * auVar376._12_4_;
      fVar366 = (float)local_1f8._0_4_ + fVar422;
      fVar368 = (float)local_1f8._4_4_ + fVar429;
      fVar369 = fStack_1f0 + fVar349;
      fVar370 = fStack_1ec + fVar350;
      fVar367 = -fVar381 * fVar321 * auVar376._0_4_;
      fVar362 = -fVar372 * fVar341 * auVar376._4_4_;
      fVar364 = -fVar380 * fVar327 * auVar376._8_4_;
      fVar365 = -fVar383 * fVar352 * auVar376._12_4_;
      fVar372 = fVar342 + fVar367;
      fVar380 = fVar348 + fVar362;
      fVar383 = fStack_3b0 + fVar364;
      fVar385 = fStack_3ac + fVar365;
      fVar363 = fVar321 * 0.0 * auVar376._0_4_;
      fVar356 = fVar341 * 0.0 * auVar376._4_4_;
      fVar357 = fVar327 * 0.0 * auVar376._8_4_;
      fVar358 = fVar352 * 0.0 * auVar376._12_4_;
      fVar325 = local_188 - fVar387;
      fVar328 = fStack_184 - fVar394;
      fVar343 = fStack_180 - fVar277;
      fVar351 = fStack_17c - fVar322;
      fVar388 = fVar145 + fVar363;
      fVar395 = fVar202 + fVar356;
      fVar397 = fVar205 + fVar357;
      fVar278 = fVar206 + fVar358;
      fVar321 = local_348 - fVar324;
      fVar327 = fStack_344 - fVar339;
      fVar341 = fStack_340 - fVar347;
      fVar352 = fStack_33c - fVar355;
      fVar250 = fVar250 - fVar323;
      fVar271 = fVar271 - fVar326;
      fVar272 = fVar272 - fVar329;
      fVar273 = fVar273 - fVar371;
      uVar137 = -(uint)(0.0 < (fVar321 * (fVar388 - fVar250) - fVar250 * (fVar372 - fVar321)) * 0.0
                              + (fVar250 * (fVar366 - fVar325) - (fVar388 - fVar250) * fVar325) *
                                0.0 + ((fVar372 - fVar321) * fVar325 - (fVar366 - fVar325) * fVar321
                                      ));
      uVar138 = -(uint)(0.0 < (fVar327 * (fVar395 - fVar271) - fVar271 * (fVar380 - fVar327)) * 0.0
                              + (fVar271 * (fVar368 - fVar328) - (fVar395 - fVar271) * fVar328) *
                                0.0 + ((fVar380 - fVar327) * fVar328 - (fVar368 - fVar328) * fVar327
                                      ));
      uVar139 = -(uint)(0.0 < (fVar341 * (fVar397 - fVar272) - fVar272 * (fVar383 - fVar341)) * 0.0
                              + (fVar272 * (fVar369 - fVar343) - (fVar397 - fVar272) * fVar343) *
                                0.0 + ((fVar383 - fVar341) * fVar343 - (fVar369 - fVar343) * fVar341
                                      ));
      uVar140 = -(uint)(0.0 < (fVar352 * (fVar278 - fVar273) - fVar273 * (fVar385 - fVar352)) * 0.0
                              + (fVar273 * (fVar370 - fVar351) - (fVar278 - fVar273) * fVar351) *
                                0.0 + ((fVar385 - fVar352) * fVar351 - (fVar370 - fVar351) * fVar352
                                      ));
      fVar422 = (float)((uint)((float)local_1f8._0_4_ - fVar422) & uVar137 |
                       ~uVar137 & (uint)(local_188 + fVar387));
      fVar429 = (float)((uint)((float)local_1f8._4_4_ - fVar429) & uVar138 |
                       ~uVar138 & (uint)(fStack_184 + fVar394));
      fVar277 = (float)((uint)(fStack_1f0 - fVar349) & uVar139 |
                       ~uVar139 & (uint)(fStack_180 + fVar277));
      fVar322 = (float)((uint)(fStack_1ec - fVar350) & uVar140 |
                       ~uVar140 & (uint)(fStack_17c + fVar322));
      fVar367 = (float)((uint)(fVar342 - fVar367) & uVar137 | ~uVar137 & (uint)(local_348 + fVar324)
                       );
      fVar362 = (float)((uint)(fVar348 - fVar362) & uVar138 |
                       ~uVar138 & (uint)(fStack_344 + fVar339));
      fStack_3b0 = (float)((uint)(fStack_3b0 - fVar364) & uVar139 |
                          ~uVar139 & (uint)(fStack_340 + fVar347));
      fStack_3ac = (float)((uint)(fStack_3ac - fVar365) & uVar140 |
                          ~uVar140 & (uint)(fStack_33c + fVar355));
      fVar364 = (float)((uint)(fVar145 - fVar363) & uVar137 | ~uVar137 & local_378._0_4_);
      fVar365 = (float)((uint)(fVar202 - fVar356) & uVar138 | ~uVar138 & local_378._4_4_);
      fVar387 = (float)((uint)(fVar205 - fVar357) & uVar139 | ~uVar139 & (uint)fStack_370);
      fVar394 = (float)((uint)(fVar206 - fVar358) & uVar140 | ~uVar140 & (uint)fStack_36c);
      fVar348 = (float)((uint)fVar325 & uVar137 | ~uVar137 & (uint)fVar366);
      fVar349 = (float)((uint)fVar328 & uVar138 | ~uVar138 & (uint)fVar368);
      fVar350 = (float)((uint)fVar343 & uVar139 | ~uVar139 & (uint)fVar369);
      fVar381 = (float)((uint)fVar351 & uVar140 | ~uVar140 & (uint)fVar370);
      fVar324 = (float)((uint)fVar321 & uVar137 | ~uVar137 & (uint)fVar372);
      fVar339 = (float)((uint)fVar327 & uVar138 | ~uVar138 & (uint)fVar380);
      fVar347 = (float)((uint)fVar341 & uVar139 | ~uVar139 & (uint)fVar383);
      fVar355 = (float)((uint)fVar352 & uVar140 | ~uVar140 & (uint)fVar385);
      fVar363 = (float)((uint)fVar250 & uVar137 | ~uVar137 & (uint)fVar388);
      fVar356 = (float)((uint)fVar271 & uVar138 | ~uVar138 & (uint)fVar395);
      fVar357 = (float)((uint)fVar272 & uVar139 | ~uVar139 & (uint)fVar397);
      fVar358 = (float)((uint)fVar273 & uVar140 | ~uVar140 & (uint)fVar278);
      fVar366 = (float)((uint)fVar366 & uVar137 | ~uVar137 & (uint)fVar325) - fVar422;
      fVar368 = (float)((uint)fVar368 & uVar138 | ~uVar138 & (uint)fVar328) - fVar429;
      fVar369 = (float)((uint)fVar369 & uVar139 | ~uVar139 & (uint)fVar343) - fVar277;
      fVar351 = (float)((uint)fVar370 & uVar140 | ~uVar140 & (uint)fVar351) - fVar322;
      fVar370 = (float)((uint)fVar372 & uVar137 | ~uVar137 & (uint)fVar321) - fVar367;
      fVar372 = (float)((uint)fVar380 & uVar138 | ~uVar138 & (uint)fVar327) - fVar362;
      fVar380 = (float)((uint)fVar383 & uVar139 | ~uVar139 & (uint)fVar341) - fStack_3b0;
      fVar383 = (float)((uint)fVar385 & uVar140 | ~uVar140 & (uint)fVar352) - fStack_3ac;
      fVar385 = (float)((uint)fVar388 & uVar137 | ~uVar137 & (uint)fVar250) - fVar364;
      fVar388 = (float)((uint)fVar395 & uVar138 | ~uVar138 & (uint)fVar271) - fVar365;
      fVar395 = (float)((uint)fVar397 & uVar139 | ~uVar139 & (uint)fVar272) - fVar387;
      fVar397 = (float)((uint)fVar278 & uVar140 | ~uVar140 & (uint)fVar273) - fVar394;
      fVar250 = fVar422 - fVar348;
      fVar271 = fVar429 - fVar349;
      fVar272 = fVar277 - fVar350;
      fVar273 = fVar322 - fVar381;
      fVar325 = fVar367 - fVar324;
      fVar328 = fVar362 - fVar339;
      fVar342 = fStack_3b0 - fVar347;
      fVar343 = fStack_3ac - fVar355;
      local_3b8 = CONCAT44(fVar362,fVar367);
      fVar321 = fVar364 - fVar363;
      fVar327 = fVar365 - fVar356;
      fVar341 = fVar387 - fVar357;
      fVar352 = fVar394 - fVar358;
      fVar145 = (fVar367 * fVar385 - fVar364 * fVar370) * 0.0 +
                (fVar364 * fVar366 - fVar422 * fVar385) * 0.0 +
                (fVar422 * fVar370 - fVar367 * fVar366);
      fVar202 = (fVar362 * fVar388 - fVar365 * fVar372) * 0.0 +
                (fVar365 * fVar368 - fVar429 * fVar388) * 0.0 +
                (fVar429 * fVar372 - fVar362 * fVar368);
      auVar261._4_4_ = fVar202;
      auVar261._0_4_ = fVar145;
      fVar205 = (fStack_3b0 * fVar395 - fVar387 * fVar380) * 0.0 +
                (fVar387 * fVar369 - fVar277 * fVar395) * 0.0 +
                (fVar277 * fVar380 - fStack_3b0 * fVar369);
      fVar206 = (fStack_3ac * fVar397 - fVar394 * fVar383) * 0.0 +
                (fVar394 * fVar351 - fVar322 * fVar397) * 0.0 +
                (fVar322 * fVar383 - fStack_3ac * fVar351);
      auVar413._0_4_ =
           (fVar324 * fVar321 - fVar363 * fVar325) * 0.0 +
           (fVar363 * fVar250 - fVar348 * fVar321) * 0.0 + (fVar348 * fVar325 - fVar324 * fVar250);
      auVar413._4_4_ =
           (fVar339 * fVar327 - fVar356 * fVar328) * 0.0 +
           (fVar356 * fVar271 - fVar349 * fVar327) * 0.0 + (fVar349 * fVar328 - fVar339 * fVar271);
      auVar413._8_4_ =
           (fVar347 * fVar341 - fVar357 * fVar342) * 0.0 +
           (fVar357 * fVar272 - fVar350 * fVar341) * 0.0 + (fVar350 * fVar342 - fVar347 * fVar272);
      auVar413._12_4_ =
           (fVar355 * fVar352 - fVar358 * fVar343) * 0.0 +
           (fVar358 * fVar273 - fVar381 * fVar352) * 0.0 + (fVar381 * fVar343 - fVar355 * fVar273);
      auVar261._8_4_ = fVar205;
      auVar261._12_4_ = fVar206;
      auVar308 = maxps(auVar261,auVar413);
      bVar30 = auVar308._0_4_ <= 0.0 && bVar30;
      auVar262._0_4_ = -(uint)bVar30;
      bVar97 = auVar308._4_4_ <= 0.0 && bVar97;
      auVar262._4_4_ = -(uint)bVar97;
      bVar29 = auVar308._8_4_ <= 0.0 && bVar29;
      auVar262._8_4_ = -(uint)bVar29;
      bVar28 = auVar308._12_4_ <= 0.0 && bVar28;
      auVar262._12_4_ = -(uint)bVar28;
      iVar199 = movmskps(iVar199,auVar262);
      if (iVar199 == 0) {
LAB_003a27d5:
        auVar263._8_8_ = uVar123;
        auVar263._0_8_ = uVar122;
      }
      else {
        fVar324 = (ray->super_RayK<1>).tfar;
        auVar311._0_4_ = fVar321 * fVar370;
        auVar311._4_4_ = fVar327 * fVar372;
        auVar311._8_4_ = fVar341 * fVar380;
        auVar311._12_4_ = fVar352 * fVar383;
        fVar356 = fVar325 * fVar385 - auVar311._0_4_;
        fVar357 = fVar328 * fVar388 - auVar311._4_4_;
        fVar358 = fVar342 * fVar395 - auVar311._8_4_;
        fVar348 = fVar343 * fVar397 - auVar311._12_4_;
        fVar321 = fVar321 * fVar366 - fVar385 * fVar250;
        fVar339 = fVar327 * fVar368 - fVar388 * fVar271;
        fVar347 = fVar341 * fVar369 - fVar395 * fVar272;
        fVar355 = fVar352 * fVar351 - fVar397 * fVar273;
        fVar325 = fVar250 * fVar370 - fVar325 * fVar366;
        fVar328 = fVar271 * fVar372 - fVar328 * fVar368;
        fVar342 = fVar272 * fVar380 - fVar342 * fVar369;
        fVar343 = fVar273 * fVar383 - fVar343 * fVar351;
        auVar335._0_4_ = fVar356 * 0.0 + fVar321 * 0.0 + fVar325;
        auVar335._4_4_ = fVar357 * 0.0 + fVar339 * 0.0 + fVar328;
        auVar335._8_4_ = fVar358 * 0.0 + fVar347 * 0.0 + fVar342;
        auVar335._12_4_ = fVar348 * 0.0 + fVar355 * 0.0 + fVar343;
        auVar308 = rcpps(auVar311,auVar335);
        fVar327 = auVar308._0_4_;
        fVar341 = auVar308._4_4_;
        fVar352 = auVar308._8_4_;
        fVar363 = auVar308._12_4_;
        fVar327 = (1.0 - auVar335._0_4_ * fVar327) * fVar327 + fVar327;
        fVar341 = (1.0 - auVar335._4_4_ * fVar341) * fVar341 + fVar341;
        fVar352 = (1.0 - auVar335._8_4_ * fVar352) * fVar352 + fVar352;
        fVar363 = (1.0 - auVar335._12_4_ * fVar363) * fVar363 + fVar363;
        fVar321 = (fVar364 * fVar325 + fVar367 * fVar321 + fVar422 * fVar356) * fVar327;
        fVar339 = (fVar365 * fVar328 + fVar362 * fVar339 + fVar429 * fVar357) * fVar341;
        fVar347 = (fVar387 * fVar342 + fStack_3b0 * fVar347 + fVar277 * fVar358) * fVar352;
        fVar355 = (fVar394 * fVar343 + fStack_3ac * fVar355 + fVar322 * fVar348) * fVar363;
        bVar30 = (fVar321 <= fVar324 && local_1d8 <= fVar321) && bVar30;
        auVar188._0_4_ = -(uint)bVar30;
        bVar97 = (fVar339 <= fVar324 && local_1d8 <= fVar339) && bVar97;
        auVar188._4_4_ = -(uint)bVar97;
        bVar29 = (fVar347 <= fVar324 && local_1d8 <= fVar347) && bVar29;
        auVar188._8_4_ = -(uint)bVar29;
        bVar28 = (fVar355 <= fVar324 && local_1d8 <= fVar355) && bVar28;
        auVar188._12_4_ = -(uint)bVar28;
        iVar199 = movmskps(iVar199,auVar188);
        if (iVar199 == 0) goto LAB_003a27d5;
        auVar189._0_8_ =
             CONCAT44(-(uint)(auVar335._4_4_ != 0.0 && bVar97),
                      -(uint)(auVar335._0_4_ != 0.0 && bVar30));
        auVar189._8_4_ = -(uint)(auVar335._8_4_ != 0.0 && bVar29);
        auVar189._12_4_ = -(uint)(auVar335._12_4_ != 0.0 && bVar28);
        iVar199 = movmskps(iVar199,auVar189);
        auVar263._8_8_ = uVar123;
        auVar263._0_8_ = uVar122;
        if (iVar199 != 0) {
          fVar145 = fVar145 * fVar327;
          fVar202 = fVar202 * fVar341;
          fVar205 = fVar205 * fVar352;
          fVar206 = fVar206 * fVar363;
          local_3c8 = (float)((uint)(1.0 - fVar145) & uVar137 | ~uVar137 & (uint)fVar145);
          fStack_3c4 = (float)((uint)(1.0 - fVar202) & uVar138 | ~uVar138 & (uint)fVar202);
          fStack_3c0 = (float)((uint)(1.0 - fVar205) & uVar139 | ~uVar139 & (uint)fVar205);
          fStack_3bc = (float)((uint)(1.0 - fVar206) & uVar140 | ~uVar140 & (uint)fVar206);
          auVar263._8_4_ = auVar189._8_4_;
          auVar263._0_8_ = auVar189._0_8_;
          auVar263._12_4_ = auVar189._12_4_;
          local_198 = (float)(~uVar137 & (uint)(auVar413._0_4_ * fVar327) |
                             (uint)(1.0 - auVar413._0_4_ * fVar327) & uVar137);
          fStack_194 = (float)(~uVar138 & (uint)(auVar413._4_4_ * fVar341) |
                              (uint)(1.0 - auVar413._4_4_ * fVar341) & uVar138);
          fStack_190 = (float)(~uVar139 & (uint)(auVar413._8_4_ * fVar352) |
                              (uint)(1.0 - auVar413._8_4_ * fVar352) & uVar139);
          fStack_18c = (float)(~uVar140 & (uint)(auVar413._12_4_ * fVar363) |
                              (uint)(1.0 - auVar413._12_4_ * fVar363) & uVar140);
          local_3d8 = fVar321;
          fStack_3d4 = fVar339;
          fStack_3d0 = fVar347;
          fStack_3cc = fVar355;
        }
      }
      iVar199 = movmskps(iVar199,auVar263);
      if (iVar199 != 0) {
        fVar331 = (auVar376._0_4_ - fVar331) * local_3c8 + fVar331;
        fVar340 = (auVar376._4_4_ - fVar340) * fStack_3c4 + fVar340;
        fVar324 = (auVar376._8_4_ - auVar334._8_4_) * fStack_3c0 + auVar334._8_4_;
        fVar327 = (auVar376._12_4_ - auVar334._12_4_) * fStack_3bc + auVar334._12_4_;
        fVar321 = pre->depth_scale;
        aVar190._0_4_ = -(uint)(fVar321 * (fVar331 + fVar331) < local_3d8) & auVar263._0_4_;
        aVar190._4_4_ = -(uint)(fVar321 * (fVar340 + fVar340) < fStack_3d4) & auVar263._4_4_;
        aVar190.i[2] = -(uint)(fVar321 * (fVar324 + fVar324) < fStack_3d0) & auVar263._8_4_;
        aVar190.i[3] = -(uint)(fVar321 * (fVar327 + fVar327) < fStack_3cc) & auVar263._12_4_;
        iVar199 = movmskps(uVar131,(undefined1  [16])aVar190);
        if (iVar199 != 0) {
          local_198 = local_198 + local_198 + -1.0;
          fStack_194 = fStack_194 + fStack_194 + -1.0;
          fStack_190 = fStack_190 + fStack_190 + -1.0;
          fStack_18c = fStack_18c + fStack_18c + -1.0;
          bhit.U.field_0.v[0] = local_3c8;
          bhit.U.field_0.v[1] = fStack_3c4;
          bhit.U.field_0.v[2] = fStack_3c0;
          bhit.U.field_0.v[3] = fStack_3bc;
          bhit.V.field_0.v[0] = local_198;
          bhit.V.field_0.v[1] = fStack_194;
          bhit.V.field_0.v[2] = fStack_190;
          bhit.V.field_0.v[3] = fStack_18c;
          bhit.T.field_0.v[0] = local_3d8;
          bhit.T.field_0.v[1] = fStack_3d4;
          bhit.T.field_0.v[2] = fStack_3d0;
          bhit.T.field_0.v[3] = fStack_3cc;
          bhit.i = 0;
          bhit.N = iVar144;
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._0_8_ =
               CONCAT44(fStack_334,local_338);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._8_8_ =
               CONCAT44(fVar398,fStack_330);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._0_8_ =
               CONCAT44(fVar420,fVar411);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._8_8_ =
               CONCAT44(fVar427,fVar426);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._0_8_ =
               CONCAT44(fVar434,fVar431);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._8_8_ =
               CONCAT44(fVar410,fVar408);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._0_8_ =
               CONCAT44(fVar405,fVar404);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._8_8_ =
               CONCAT44(fVar409,fVar407);
          bhit.valid.field_0 = aVar190;
          uVar137 = (ray->super_RayK<1>).mask;
          if ((pGVar25->mask & uVar137) != 0) {
            valid.field_0 = aVar190;
            fVar406 = 1.0 / local_208;
            bhit.vu.field_0.v[0] = fVar406 * (local_3c8 + 0.0);
            bhit.vu.field_0.v[1] = fVar406 * (fStack_3c4 + 1.0);
            bhit.vu.field_0.v[2] = fVar406 * (fStack_3c0 + 2.0);
            bhit.vu.field_0.v[3] = fVar406 * (fStack_3bc + 3.0);
            bhit.vv.field_0._0_8_ = CONCAT44(fStack_194,local_198);
            bhit.vv.field_0._8_8_ = CONCAT44(fStack_18c,fStack_190);
            bhit.vt.field_0.v[0] = local_3d8;
            bhit.vt.field_0.v[1] = fStack_3d4;
            bhit.vt.field_0.v[2] = fStack_3d0;
            bhit.vt.field_0.v[3] = fStack_3cc;
            auVar213._0_4_ = aVar190._0_4_ & (uint)local_3d8;
            auVar213._4_4_ = aVar190._4_4_ & (uint)fStack_3d4;
            auVar213._8_4_ = aVar190.i[2] & (uint)fStack_3d0;
            auVar213._12_4_ = aVar190.i[3] & (uint)fStack_3cc;
            auVar242._0_8_ = CONCAT44(~aVar190._4_4_,~aVar190._0_4_) & 0x7f8000007f800000;
            auVar242._8_4_ = ~aVar190.i[2] & 0x7f800000;
            auVar242._12_4_ = ~aVar190.i[3] & 0x7f800000;
            auVar242 = auVar242 | auVar213;
            auVar264._4_4_ = auVar242._0_4_;
            auVar264._0_4_ = auVar242._4_4_;
            auVar264._8_4_ = auVar242._12_4_;
            auVar264._12_4_ = auVar242._8_4_;
            auVar308 = minps(auVar264,auVar242);
            auVar214._0_8_ = auVar308._8_8_;
            auVar214._8_4_ = auVar308._0_4_;
            auVar214._12_4_ = auVar308._4_4_;
            auVar308 = minps(auVar214,auVar308);
            auVar215._0_8_ =
                 CONCAT44(-(uint)(auVar308._4_4_ == auVar242._4_4_) & aVar190._4_4_,
                          -(uint)(auVar308._0_4_ == auVar242._0_4_) & aVar190._0_4_);
            auVar215._8_4_ = -(uint)(auVar308._8_4_ == auVar242._8_4_) & aVar190.i[2];
            auVar215._12_4_ = -(uint)(auVar308._12_4_ == auVar242._12_4_) & aVar190.i[3];
            iVar199 = movmskps(uVar137,auVar215);
            if (iVar199 != 0) {
              aVar190.i[2] = auVar215._8_4_;
              aVar190._0_8_ = auVar215._0_8_;
              aVar190.i[3] = auVar215._12_4_;
            }
            uVar137 = movmskps(iVar199,(undefined1  [16])aVar190);
            lVar135 = 0;
            if (uVar137 != 0) {
              for (; (uVar137 >> lVar135 & 1) == 0; lVar135 = lVar135 + 1) {
              }
            }
            fVar406 = local_3c8;
            fVar321 = fStack_3c4;
            fVar324 = fStack_3c0;
            fVar327 = fStack_3bc;
            fVar339 = local_3d8;
            fVar341 = fStack_3d4;
            fVar347 = fStack_3d0;
            fVar352 = fStack_3cc;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar25->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar355 = bhit.vu.field_0.v[lVar135];
              fVar367 = bhit.vv.field_0.v[lVar135];
              fVar362 = 1.0 - fVar355;
              fVar356 = fVar355 * fVar362 + fVar355 * fVar362;
              fVar363 = fVar362 * fVar362 * -3.0;
              fVar357 = (fVar362 * fVar362 - fVar356) * 3.0;
              fVar362 = (fVar356 - fVar355 * fVar355) * 3.0;
              fVar356 = fVar355 * fVar355 * 3.0;
              (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar135];
              *(ulong *)&(ray->Ng).field_0 =
                   CONCAT44(fVar363 * fStack_334 +
                            fVar357 * fVar420 + fVar362 * fVar434 + fVar356 * fVar405,
                            fVar363 * local_338 +
                            fVar357 * fVar411 + fVar362 * fVar431 + fVar356 * fVar404);
              (ray->Ng).field_0.field_0.z =
                   fVar363 * fStack_330 + fVar357 * fVar426 + fVar362 * fVar408 + fVar356 * fVar407;
              ray->u = fVar355;
              ray->v = fVar367;
              ray->primID = (uint)local_360;
              ray->geomID = (uint)local_390;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              pRVar129 = (RTCIntersectArguments *)context;
            }
            else {
              _local_468 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
LAB_003a3829:
              local_23c = bhit.vu.field_0.v[lVar135];
              local_238 = bhit.vv.field_0.v[lVar135];
              (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar135];
              args.context = context->user;
              fVar355 = 1.0 - local_23c;
              fVar362 = local_23c * fVar355 + local_23c * fVar355;
              fVar367 = fVar355 * fVar355 * -3.0;
              fVar363 = (fVar355 * fVar355 - fVar362) * 3.0;
              fVar355 = (fVar362 - local_23c * local_23c) * 3.0;
              fVar362 = local_23c * local_23c * 3.0;
              local_248 = CONCAT44(fVar367 * fStack_334 +
                                   fVar363 * fVar420 + fVar355 * fVar434 + fVar362 * fVar405,
                                   fVar367 * local_338 +
                                   fVar363 * fVar411 + fVar355 * fVar431 + fVar362 * fVar404);
              local_240 = fVar367 * fStack_330 +
                          fVar363 * fVar426 + fVar355 * fVar408 + fVar362 * fVar407;
              local_234 = (int)local_360;
              local_230 = (int)local_390;
              local_22c = (args.context)->instID[0];
              local_228 = (args.context)->instPrimID[0];
              local_42c = -1;
              args.valid = &local_42c;
              pRVar129 = (RTCIntersectArguments *)pGVar25->userPtr;
              args.geometryUserPtr = pRVar129;
              args.ray = (RTCRayN *)ray;
              args.hit = (RTCHitN *)&local_248;
              args.N = 1;
              if (pGVar25->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_003a39d0:
                pRVar129 = context->args;
                if (((RTCIntersectArguments *)pRVar129->filter != (RTCIntersectArguments *)0x0) &&
                   ((((ulong)*(Scene **)&pRVar129->flags & 2) != 0 ||
                    (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                  (*(code *)pRVar129->filter)(&args);
                  uVar130 = extraout_RDX_02;
                  ray = local_210;
                  fVar406 = local_3c8;
                  fVar321 = fStack_3c4;
                  fVar324 = fStack_3c0;
                  fVar327 = fStack_3bc;
                  fVar339 = local_3d8;
                  fVar341 = fStack_3d4;
                  fVar347 = fStack_3d0;
                  fVar352 = fStack_3cc;
                  fVar359 = (float)local_408;
                  fVar435 = local_408._4_4_;
                  fVar330 = fStack_400;
                  fVar276 = fStack_3fc;
                  if (*args.valid == 0) goto LAB_003a3a94;
                }
                *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                uVar130 = (ulong)*(uint *)(args.hit + 0x1c);
                *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                pRVar129 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                pRVar127 = args.ray;
              }
              else {
                (*pGVar25->intersectionFilterN)(&args);
                uVar130 = extraout_RDX_01;
                ray = local_210;
                fVar406 = local_3c8;
                fVar321 = fStack_3c4;
                fVar324 = fStack_3c0;
                fVar327 = fStack_3bc;
                fVar339 = local_3d8;
                fVar341 = fStack_3d4;
                fVar347 = fStack_3d0;
                fVar352 = fStack_3cc;
                fVar359 = (float)local_408;
                fVar435 = local_408._4_4_;
                fVar330 = fStack_400;
                fVar276 = fStack_3fc;
                if (*args.valid != 0) goto LAB_003a39d0;
LAB_003a3a94:
                (local_210->super_RayK<1>).tfar = (float)local_468._0_4_;
                pRVar127 = (RTCRayN *)args.valid;
                ray = local_210;
                fVar406 = local_3c8;
                fVar321 = fStack_3c4;
                fVar324 = fStack_3c0;
                fVar327 = fStack_3bc;
                fVar339 = local_3d8;
                fVar341 = fStack_3d4;
                fVar347 = fStack_3d0;
                fVar352 = fStack_3cc;
                fVar330 = fStack_400;
                fVar276 = fStack_3fc;
              }
              valid.field_0.v[lVar135] = 0.0;
              fVar355 = (ray->super_RayK<1>).tfar;
              local_468._0_4_ = (ray->super_RayK<1>).tfar;
              unique0x100053d9 = (float)(ray->super_RayK<1>).mask;
              fStack_460 = (float)(ray->super_RayK<1>).id;
              unique0x100053e1 = (ray->super_RayK<1>).flags;
              aVar194._0_4_ = -(uint)(fVar339 <= fVar355) & valid.field_0.i[0];
              aVar194._4_4_ = -(uint)(fVar341 <= fVar355) & valid.field_0.i[1];
              aVar194.i[2] = -(uint)(fVar347 <= fVar355) & valid.field_0.i[2];
              aVar194.i[3] = -(uint)(fVar352 <= fVar355) & valid.field_0.i[3];
              valid.field_0 = aVar194;
              iVar199 = movmskps((int)pRVar127,(undefined1  [16])aVar194);
              if (iVar199 != 0) {
                auVar223._0_4_ = aVar194._0_4_ & (uint)fVar339;
                auVar223._4_4_ = aVar194._4_4_ & (uint)fVar341;
                auVar223._8_4_ = aVar194.i[2] & (uint)fVar347;
                auVar223._12_4_ = aVar194.i[3] & (uint)fVar352;
                auVar248._0_8_ = CONCAT44(~aVar194._4_4_,~aVar194._0_4_) & 0x7f8000007f800000;
                auVar248._8_4_ = ~aVar194.i[2] & 0x7f800000;
                auVar248._12_4_ = ~aVar194.i[3] & 0x7f800000;
                auVar248 = auVar248 | auVar223;
                auVar269._4_4_ = auVar248._0_4_;
                auVar269._0_4_ = auVar248._4_4_;
                auVar269._8_4_ = auVar248._12_4_;
                auVar269._12_4_ = auVar248._8_4_;
                auVar308 = minps(auVar269,auVar248);
                auVar224._0_8_ = auVar308._8_8_;
                auVar224._8_4_ = auVar308._0_4_;
                auVar224._12_4_ = auVar308._4_4_;
                auVar308 = minps(auVar224,auVar308);
                auVar225._0_8_ =
                     CONCAT44(-(uint)(auVar308._4_4_ == auVar248._4_4_) & aVar194._4_4_,
                              -(uint)(auVar308._0_4_ == auVar248._0_4_) & aVar194._0_4_);
                auVar225._8_4_ = -(uint)(auVar308._8_4_ == auVar248._8_4_) & aVar194.i[2];
                auVar225._12_4_ = -(uint)(auVar308._12_4_ == auVar248._12_4_) & aVar194.i[3];
                iVar199 = movmskps(iVar199,auVar225);
                if (iVar199 != 0) {
                  aVar194.i[2] = auVar225._8_4_;
                  aVar194._0_8_ = auVar225._0_8_;
                  aVar194.i[3] = auVar225._12_4_;
                }
                uVar124 = movmskps(iVar199,(undefined1  [16])aVar194);
                uVar128 = CONCAT44((int)((ulong)pRVar127 >> 0x20),uVar124);
                lVar135 = 0;
                if (uVar128 != 0) {
                  for (; (uVar128 >> lVar135 & 1) == 0; lVar135 = lVar135 + 1) {
                  }
                }
                goto LAB_003a3829;
              }
            }
            fStack_3cc = fVar352;
            fStack_3d0 = fVar347;
            fStack_3d4 = fVar341;
            local_3d8 = fVar339;
            local_3c8 = fVar406;
            fStack_3c4 = fVar321;
            fStack_3c0 = fVar324;
            fStack_3bc = fVar327;
            fVar406 = (float)local_3f8._0_4_;
          }
        }
      }
    }
    uVar124 = SUB84(pRVar129,0);
    if (4 < iVar144) {
      local_208 = 1.0 / local_208;
      fStack_204 = local_208;
      fStack_200 = local_208;
      fStack_1fc = local_208;
      lVar135 = 4;
      stack0xfffffffffffffc0c = fVar406;
      local_3f8._0_4_ = fVar406;
      fStack_3f0 = fVar406;
      fStack_3ec = fVar406;
      iVar199 = iVar144;
      while( true ) {
        uVar124 = SUB84(pRVar129,0);
        if (lVar134 <= lVar135) break;
        uVar138 = (uint)lVar135;
        bVar28 = (int)(uVar138 | 1) < iVar144;
        bVar29 = (int)(uVar138 | 2) < iVar144;
        fStack_3b0 = (float)-(uint)bVar29;
        bVar30 = (int)(uVar138 | 3) < iVar144;
        fStack_3ac = (float)-(uint)bVar30;
        local_3b8 = CONCAT44(-(uint)bVar28,-(uint)((int)uVar138 < iVar144));
        pRVar129 = (RTCIntersectArguments *)(bezier_basis0 + lVar133);
        pauVar8 = (undefined1 (*) [16])((long)&pRVar129->flags + lVar135 * 4);
        fVar406 = *(float *)*pauVar8;
        fVar321 = *(float *)(*pauVar8 + 4);
        fVar324 = *(float *)(*pauVar8 + 8);
        auVar72 = *(undefined1 (*) [12])*pauVar8;
        fVar327 = *(float *)(*pauVar8 + 0xc);
        _local_378 = *pauVar8;
        pfVar1 = (float *)(lVar133 + 0x21fb768 + lVar135 * 4);
        fVar339 = *pfVar1;
        fVar341 = pfVar1[1];
        fVar347 = pfVar1[2];
        fVar352 = pfVar1[3];
        pfVar1 = (float *)(lVar133 + 0x21fbbec + lVar135 * 4);
        local_1a8 = *pfVar1;
        fStack_1a4 = pfVar1[1];
        fStack_1a0 = pfVar1[2];
        fStack_19c = pfVar1[3];
        pfVar1 = (float *)(lVar133 + 0x21fc070 + lVar135 * 4);
        local_348 = *pfVar1;
        fStack_344 = pfVar1[1];
        fStack_340 = pfVar1[2];
        fStack_33c = pfVar1[3];
        fVar277 = fVar378 * fVar406 +
                  local_1e8 * fVar339 + fVar359 * local_1a8 + local_3a8 * local_348;
        fVar322 = fVar378 * fVar321 +
                  fStack_1e4 * fVar341 + fVar435 * fStack_1a4 + fStack_3a4 * fStack_344;
        fVar325 = fVar378 * fVar324 +
                  fStack_1e0 * fVar347 + fVar330 * fStack_1a0 + fStack_3a0 * fStack_340;
        fVar328 = fVar378 * fVar327 +
                  fStack_1dc * fVar352 + fVar276 * fStack_19c + fStack_39c * fStack_33c;
        local_188 = local_178 * fVar406 +
                    fVar386 * fVar339 + local_418 * local_1a8 + local_428 * local_348;
        fStack_184 = fStack_174 * fVar321 +
                     fVar386 * fVar341 + fStack_414 * fStack_1a4 + fStack_424 * fStack_344;
        fStack_180 = fStack_170 * fVar324 +
                     fVar386 * fVar347 + fStack_410 * fStack_1a0 + fStack_420 * fStack_340;
        fStack_17c = fStack_16c * fVar327 +
                     fVar386 * fVar352 + fStack_40c * fStack_19c + fStack_41c * fStack_33c;
        local_3e8._0_4_ =
             fVar398 * fVar406 + fVar427 * fVar339 + fVar410 * local_1a8 + fVar409 * local_348;
        local_3e8._4_4_ =
             fVar398 * fVar321 + fVar427 * fVar341 + fVar410 * fStack_1a4 + fVar409 * fStack_344;
        iStack_3e0 = (int)(fVar398 * fVar324 +
                          fVar427 * fVar347 + fVar410 * fStack_1a0 + fVar409 * fStack_340);
        iStack_3dc = (int)(fVar398 * fVar327 +
                          fVar427 * fVar352 + fVar410 * fStack_19c + fVar409 * fStack_33c);
        pfVar1 = (float *)(bezier_basis1 + lVar133 + lVar135 * 4);
        fVar406 = *pfVar1;
        fVar321 = pfVar1[1];
        fVar324 = pfVar1[2];
        fVar355 = pfVar1[3];
        pfVar1 = (float *)(lVar133 + 0x21fdb88 + lVar135 * 4);
        fVar367 = *pfVar1;
        fVar362 = pfVar1[1];
        fVar363 = pfVar1[2];
        fVar356 = pfVar1[3];
        pfVar1 = (float *)(lVar133 + 0x21fe00c + lVar135 * 4);
        fVar357 = *pfVar1;
        fVar358 = pfVar1[1];
        fVar364 = pfVar1[2];
        fVar365 = pfVar1[3];
        pauVar9 = (undefined1 (*) [12])(lVar133 + 0x21fe490 + lVar135 * 4);
        fVar387 = *(float *)*pauVar9;
        fVar394 = *(float *)(*pauVar9 + 4);
        fVar422 = *(float *)(*pauVar9 + 8);
        auVar75 = *pauVar9;
        fVar429 = *(float *)pauVar9[1];
        fVar331 = fVar378 * fVar406 + local_1e8 * fVar367 + fVar359 * fVar357 + local_3a8 * fVar387;
        fVar340 = fVar378 * fVar321 +
                  fStack_1e4 * fVar362 + fVar435 * fVar358 + fStack_3a4 * fVar394;
        fVar342 = fVar378 * fVar324 +
                  fStack_1e0 * fVar363 + fVar330 * fVar364 + fStack_3a0 * fVar422;
        fVar343 = fVar378 * fVar355 +
                  fStack_1dc * fVar356 + fVar276 * fVar365 + fStack_39c * fVar429;
        fVar351 = local_178 * fVar406 +
                  fVar386 * fVar367 + local_418 * fVar357 + local_428 * fVar387;
        fVar381 = fStack_174 * fVar321 +
                  fVar386 * fVar362 + fStack_414 * fVar358 + fStack_424 * fVar394;
        fVar366 = fStack_170 * fVar324 +
                  fVar386 * fVar363 + fStack_410 * fVar364 + fStack_420 * fVar422;
        fVar368 = fStack_16c * fVar355 +
                  fVar386 * fVar356 + fStack_40c * fVar365 + fStack_41c * fVar429;
        auVar391._0_4_ =
             fVar398 * fVar406 + fVar427 * fVar367 + fVar410 * fVar357 + fVar409 * fVar387;
        auVar391._4_4_ =
             fVar398 * fVar321 + fVar427 * fVar362 + fVar410 * fVar358 + fVar409 * fVar394;
        auVar391._8_4_ =
             fVar398 * fVar324 + fVar427 * fVar363 + fVar410 * fVar364 + fVar409 * fVar422;
        auVar391._12_4_ =
             fVar398 * fVar355 + fVar427 * fVar356 + fVar410 * fVar365 + fVar409 * fVar429;
        fVar422 = fVar331 - fVar277;
        fVar348 = fVar340 - fVar322;
        fVar349 = fVar342 - fVar325;
        fVar350 = fVar343 - fVar328;
        fVar330 = fVar351 - local_188;
        fVar276 = fVar381 - fStack_184;
        fVar387 = fVar366 - fStack_180;
        fVar394 = fVar368 - fStack_17c;
        fVar359 = local_188 * fVar422 - fVar277 * fVar330;
        fVar435 = fStack_184 * fVar348 - fVar322 * fVar276;
        fVar369 = fStack_180 * fVar349 - fVar325 * fVar387;
        fVar370 = fStack_17c * fVar350 - fVar328 * fVar394;
        auVar308 = maxps(_local_3e8,auVar391);
        bVar97 = fVar359 * fVar359 <=
                 auVar308._0_4_ * auVar308._0_4_ * (fVar422 * fVar422 + fVar330 * fVar330) &&
                 (int)uVar138 < iVar144;
        auVar414._0_4_ = -(uint)bVar97;
        bVar28 = fVar435 * fVar435 <=
                 auVar308._4_4_ * auVar308._4_4_ * (fVar348 * fVar348 + fVar276 * fVar276) && bVar28
        ;
        auVar414._4_4_ = -(uint)bVar28;
        bVar29 = fVar369 * fVar369 <=
                 auVar308._8_4_ * auVar308._8_4_ * (fVar349 * fVar349 + fVar387 * fVar387) && bVar29
        ;
        auVar414._8_4_ = -(uint)bVar29;
        bVar30 = fVar370 * fVar370 <=
                 auVar308._12_4_ * auVar308._12_4_ * (fVar350 * fVar350 + fVar394 * fVar394) &&
                 bVar30;
        auVar414._12_4_ = -(uint)bVar30;
        uVar137 = movmskps((int)uVar130,auVar414);
        uVar130 = (ulong)uVar137;
        fVar359 = (float)local_408;
        fVar435 = local_408._4_4_;
        if (uVar137 != 0) {
          _local_1f8 = auVar391;
          local_468._0_4_ = auVar75._0_4_;
          stack0xfffffffffffffb9c = auVar75._4_4_;
          fStack_460 = auVar75._8_4_;
          fVar278 = (float)local_468._0_4_ * fVar318 + fVar357 * local_1c8 + fVar367 * fVar396 +
                    fVar406 * fVar393;
          fVar323 = stack0xfffffffffffffb9c * fVar318 + fVar358 * fStack_1c4 + fVar362 * fVar396 +
                    fVar321 * fVar393;
          fVar326 = fStack_460 * fVar318 + fVar364 * fStack_1c0 + fVar363 * fVar396 +
                    fVar324 * fVar393;
          fVar329 = fVar429 * fVar318 + fVar365 * fStack_1bc + fVar356 * fVar396 + fVar355 * fVar393
          ;
          local_378._0_4_ = auVar72._0_4_;
          local_378._4_4_ = auVar72._4_4_;
          fStack_370 = auVar72._8_4_;
          fVar271 = (float)local_378._0_4_ * fVar393;
          fVar272 = (float)local_378._4_4_ * fVar393;
          fVar273 = fStack_370 * fVar393;
          _local_378 = auVar414;
          fVar271 = local_348 * fVar318 + local_1a8 * local_1c8 + fVar339 * fVar396 + fVar271;
          fVar272 = fStack_344 * fVar318 + fStack_1a4 * fStack_1c4 + fVar341 * fVar396 + fVar272;
          fVar273 = fStack_340 * fVar318 + fStack_1a0 * fStack_1c0 + fVar347 * fVar396 + fVar273;
          fVar412 = fStack_33c * fVar318 + fStack_19c * fStack_1bc + fVar352 * fVar396 +
                    fVar327 * fVar393;
          pfVar1 = (float *)(lVar133 + 0x21fc4f4 + lVar135 * 4);
          fVar406 = *pfVar1;
          fVar321 = pfVar1[1];
          fVar324 = pfVar1[2];
          fVar327 = pfVar1[3];
          pfVar1 = (float *)(lVar133 + 0x21fc978 + lVar135 * 4);
          fVar339 = *pfVar1;
          fVar341 = pfVar1[1];
          fVar347 = pfVar1[2];
          fVar352 = pfVar1[3];
          pfVar1 = (float *)(lVar133 + 0x21fcdfc + lVar135 * 4);
          fVar355 = *pfVar1;
          fVar367 = pfVar1[1];
          fVar362 = pfVar1[2];
          fVar363 = pfVar1[3];
          pfVar1 = (float *)(lVar133 + 0x21fd280 + lVar135 * 4);
          fVar356 = *pfVar1;
          fVar357 = pfVar1[1];
          fVar358 = pfVar1[2];
          fVar364 = pfVar1[3];
          fVar416 = fVar378 * fVar406 +
                    local_1e8 * fVar339 + (float)local_408 * fVar355 + local_3a8 * fVar356;
          fVar417 = fVar378 * fVar321 +
                    fStack_1e4 * fVar341 + local_408._4_4_ * fVar367 + fStack_3a4 * fVar357;
          fVar418 = fVar378 * fVar324 +
                    fStack_1e0 * fVar347 + fStack_400 * fVar362 + fStack_3a0 * fVar358;
          fVar421 = fVar378 * fVar327 +
                    fStack_1dc * fVar352 + fStack_3fc * fVar363 + fStack_39c * fVar364;
          fVar371 = local_178 * fVar406 +
                    fVar386 * fVar339 + local_418 * fVar355 + local_428 * fVar356;
          fVar379 = fStack_174 * fVar321 +
                    fVar386 * fVar341 + fStack_414 * fVar367 + fStack_424 * fVar357;
          fVar382 = fStack_170 * fVar324 +
                    fVar386 * fVar347 + fStack_410 * fVar362 + fStack_420 * fVar358;
          fVar384 = fStack_16c * fVar327 +
                    fVar386 * fVar352 + fStack_40c * fVar363 + fStack_41c * fVar364;
          pfVar1 = (float *)(lVar133 + 0x21fe914 + lVar135 * 4);
          fVar365 = *pfVar1;
          fVar429 = pfVar1[1];
          fVar369 = pfVar1[2];
          fVar370 = pfVar1[3];
          pfVar1 = (float *)(lVar133 + 0x21ff21c + lVar135 * 4);
          fVar372 = *pfVar1;
          fVar380 = pfVar1[1];
          fVar383 = pfVar1[2];
          fVar385 = pfVar1[3];
          pfVar1 = (float *)(lVar133 + 0x21ff6a0 + lVar135 * 4);
          fVar388 = *pfVar1;
          fVar395 = pfVar1[1];
          fVar397 = pfVar1[2];
          fVar145 = pfVar1[3];
          pfVar1 = (float *)(lVar133 + 0x21fed98 + lVar135 * 4);
          fVar202 = *pfVar1;
          fVar205 = pfVar1[1];
          fVar206 = pfVar1[2];
          fVar250 = pfVar1[3];
          fVar428 = fVar378 * fVar365 +
                    local_1e8 * fVar202 + (float)local_408 * fVar372 + local_3a8 * fVar388;
          fVar432 = fVar378 * fVar429 +
                    fStack_1e4 * fVar205 + local_408._4_4_ * fVar380 + fStack_3a4 * fVar395;
          fVar436 = fVar378 * fVar369 +
                    fStack_1e0 * fVar206 + fStack_400 * fVar383 + fStack_3a0 * fVar397;
          fVar419 = fVar378 * fVar370 +
                    fStack_1dc * fVar250 + fStack_3fc * fVar385 + fStack_39c * fVar145;
          fVar423 = local_178 * fVar365 +
                    fVar386 * fVar202 + local_418 * fVar372 + local_428 * fVar388;
          fVar430 = fStack_174 * fVar429 +
                    fVar386 * fVar205 + fStack_414 * fVar380 + fStack_424 * fVar395;
          fVar433 = fStack_170 * fVar369 +
                    fVar386 * fVar206 + fStack_410 * fVar383 + fStack_420 * fVar397;
          fVar437 = fStack_16c * fVar370 +
                    fVar386 * fVar250 + fStack_40c * fVar385 + fStack_41c * fVar145;
          auVar392._0_8_ = CONCAT44(fVar417,fVar416) & 0x7fffffff7fffffff;
          auVar392._8_4_ = ABS(fVar418);
          auVar392._12_4_ = ABS(fVar421);
          auVar336._0_8_ = CONCAT44(fVar379,fVar371) & 0x7fffffff7fffffff;
          auVar336._8_4_ = ABS(fVar382);
          auVar336._12_4_ = ABS(fVar384);
          auVar308 = maxps(auVar392,auVar336);
          auVar402._0_8_ =
               CONCAT44(fVar321 * fVar393 +
                        fVar341 * fVar396 + fVar367 * fStack_1c4 + fVar357 * fVar318,
                        fVar406 * fVar393 +
                        fVar339 * fVar396 + fVar355 * local_1c8 + fVar356 * fVar318) &
               0x7fffffff7fffffff;
          auVar402._8_4_ =
               ABS(fVar324 * fVar393 + fVar347 * fVar396 + fVar362 * fStack_1c0 + fVar358 * fVar318)
          ;
          auVar402._12_4_ =
               ABS(fVar327 * fVar393 + fVar352 * fVar396 + fVar363 * fStack_1bc + fVar364 * fVar318)
          ;
          auVar308 = maxps(auVar308,auVar402);
          uVar137 = -(uint)((float)local_3f8._0_4_ <= auVar308._0_4_);
          uVar139 = -(uint)(stack0xfffffffffffffc0c <= auVar308._4_4_);
          uVar140 = -(uint)(fStack_3f0 <= auVar308._8_4_);
          uVar141 = -(uint)(fStack_3ec <= auVar308._12_4_);
          auVar337._0_4_ = ~uVar137 & (uint)fVar422;
          auVar337._4_4_ = ~uVar139 & (uint)fVar348;
          auVar337._8_4_ = ~uVar140 & (uint)fVar349;
          auVar337._12_4_ = ~uVar141 & (uint)fVar350;
          auVar377._0_4_ = (uint)fVar416 & uVar137;
          auVar377._4_4_ = (uint)fVar417 & uVar139;
          auVar377._8_4_ = (uint)fVar418 & uVar140;
          auVar377._12_4_ = (uint)fVar421 & uVar141;
          auVar377 = auVar377 | auVar337;
          fVar352 = (float)(~uVar137 & (uint)fVar330 | (uint)fVar371 & uVar137);
          fVar367 = (float)(~uVar139 & (uint)fVar276 | (uint)fVar379 & uVar139);
          fVar358 = (float)(~uVar140 & (uint)fVar387 | (uint)fVar382 & uVar140);
          fVar364 = (float)(~uVar141 & (uint)fVar394 | (uint)fVar384 & uVar141);
          auVar403._0_8_ = CONCAT44(fVar432,fVar428) & 0x7fffffff7fffffff;
          auVar403._8_4_ = ABS(fVar436);
          auVar403._12_4_ = ABS(fVar419);
          auVar243._0_8_ = CONCAT44(fVar430,fVar423) & 0x7fffffff7fffffff;
          auVar243._8_4_ = ABS(fVar433);
          auVar243._12_4_ = ABS(fVar437);
          auVar308 = maxps(auVar403,auVar243);
          auVar191._0_8_ =
               CONCAT44(fVar429 * fVar393 +
                        fVar205 * fVar396 + fVar380 * fStack_1c4 + fVar395 * fVar318,
                        fVar365 * fVar393 +
                        fVar202 * fVar396 + fVar372 * local_1c8 + fVar388 * fVar318) &
               0x7fffffff7fffffff;
          auVar191._8_4_ =
               ABS(fVar369 * fVar393 + fVar206 * fVar396 + fVar383 * fStack_1c0 + fVar397 * fVar318)
          ;
          auVar191._12_4_ =
               ABS(fVar370 * fVar393 + fVar250 * fVar396 + fVar385 * fStack_1bc + fVar145 * fVar318)
          ;
          auVar308 = maxps(auVar308,auVar191);
          uVar137 = -(uint)((float)local_3f8._0_4_ <= auVar308._0_4_);
          uVar139 = -(uint)(stack0xfffffffffffffc0c <= auVar308._4_4_);
          uVar140 = -(uint)(fStack_3f0 <= auVar308._8_4_);
          uVar141 = -(uint)(fStack_3ec <= auVar308._12_4_);
          fVar372 = (float)((uint)fVar428 & uVar137 | ~uVar137 & (uint)fVar422);
          fVar380 = (float)((uint)fVar432 & uVar139 | ~uVar139 & (uint)fVar348);
          fVar383 = (float)((uint)fVar436 & uVar140 | ~uVar140 & (uint)fVar349);
          fVar385 = (float)((uint)fVar419 & uVar141 | ~uVar141 & (uint)fVar350);
          fVar365 = (float)(~uVar137 & (uint)fVar330 | (uint)fVar423 & uVar137);
          fVar429 = (float)(~uVar139 & (uint)fVar276 | (uint)fVar430 & uVar139);
          fVar348 = (float)(~uVar140 & (uint)fVar387 | (uint)fVar433 & uVar140);
          fVar394 = (float)(~uVar141 & (uint)fVar394 | (uint)fVar437 & uVar141);
          fVar341 = auVar377._0_4_;
          fVar406 = auVar377._4_4_;
          fVar330 = auVar377._8_4_;
          fVar276 = auVar377._12_4_;
          auVar312._0_4_ = fVar352 * fVar352 + fVar341 * fVar341;
          auVar312._4_4_ = fVar367 * fVar367 + fVar406 * fVar406;
          auVar312._8_4_ = fVar358 * fVar358 + fVar330 * fVar330;
          auVar312._12_4_ = fVar364 * fVar364 + fVar276 * fVar276;
          auVar308 = rsqrtps(auVar337,auVar312);
          fVar321 = auVar308._0_4_;
          fVar324 = auVar308._4_4_;
          fVar327 = auVar308._8_4_;
          fVar339 = auVar308._12_4_;
          auVar338._0_4_ = fVar321 * fVar321 * auVar312._0_4_ * 0.5 * fVar321;
          auVar338._4_4_ = fVar324 * fVar324 * auVar312._4_4_ * 0.5 * fVar324;
          auVar338._8_4_ = fVar327 * fVar327 * auVar312._8_4_ * 0.5 * fVar327;
          auVar338._12_4_ = fVar339 * fVar339 * auVar312._12_4_ * 0.5 * fVar339;
          fVar362 = fVar321 * 1.5 - auVar338._0_4_;
          fVar363 = fVar324 * 1.5 - auVar338._4_4_;
          fVar356 = fVar327 * 1.5 - auVar338._8_4_;
          fVar357 = fVar339 * 1.5 - auVar338._12_4_;
          auVar313._0_4_ = fVar365 * fVar365 + fVar372 * fVar372;
          auVar313._4_4_ = fVar429 * fVar429 + fVar380 * fVar380;
          auVar313._8_4_ = fVar348 * fVar348 + fVar383 * fVar383;
          auVar313._12_4_ = fVar394 * fVar394 + fVar385 * fVar385;
          auVar308 = rsqrtps(auVar338,auVar313);
          fVar321 = auVar308._0_4_;
          fVar324 = auVar308._4_4_;
          fVar327 = auVar308._8_4_;
          fVar339 = auVar308._12_4_;
          fVar347 = fVar321 * 1.5 - fVar321 * fVar321 * auVar313._0_4_ * 0.5 * fVar321;
          fVar324 = fVar324 * 1.5 - fVar324 * fVar324 * auVar313._4_4_ * 0.5 * fVar324;
          fVar355 = fVar327 * 1.5 - fVar327 * fVar327 * auVar313._8_4_ * 0.5 * fVar327;
          fVar339 = fVar339 * 1.5 - fVar339 * fVar339 * auVar313._12_4_ * 0.5 * fVar339;
          fVar388 = fVar352 * fVar362 * (float)local_3e8._0_4_;
          fVar397 = fVar367 * fVar363 * (float)local_3e8._4_4_;
          fVar202 = fVar358 * fVar356 * (float)iStack_3e0;
          fVar206 = fVar364 * fVar357 * (float)iStack_3dc;
          fVar327 = -fVar341 * fVar362 * (float)local_3e8._0_4_;
          fVar341 = -fVar406 * fVar363 * (float)local_3e8._4_4_;
          fVar352 = -fVar330 * fVar356 * (float)iStack_3e0;
          fVar367 = -fVar276 * fVar357 * (float)iStack_3dc;
          fVar358 = fVar362 * 0.0 * (float)local_3e8._0_4_;
          fVar364 = fVar363 * 0.0 * (float)local_3e8._4_4_;
          fVar387 = fVar356 * 0.0 * (float)iStack_3e0;
          fVar422 = fVar357 * 0.0 * (float)iStack_3dc;
          local_348 = fVar271 + fVar358;
          fStack_344 = fVar272 + fVar364;
          fStack_340 = fVar273 + fVar387;
          fStack_33c = fVar412 + fVar422;
          fVar371 = fVar365 * fVar347 * auVar391._0_4_;
          fVar379 = fVar429 * fVar324 * auVar391._4_4_;
          fVar382 = fVar348 * fVar355 * auVar391._8_4_;
          fVar384 = fVar394 * fVar339 * auVar391._12_4_;
          fVar349 = fVar331 + fVar371;
          fVar350 = fVar340 + fVar379;
          fVar369 = fVar342 + fVar382;
          fVar370 = fVar343 + fVar384;
          fVar406 = -fVar372 * fVar347 * auVar391._0_4_;
          fVar330 = -fVar380 * fVar324 * auVar391._4_4_;
          fVar276 = -fVar383 * fVar355 * auVar391._8_4_;
          fVar321 = -fVar385 * fVar339 * auVar391._12_4_;
          fVar372 = fVar351 + fVar406;
          fVar380 = fVar381 + fVar330;
          fVar383 = fVar366 + fVar276;
          fVar385 = fVar368 + fVar321;
          fVar362 = fVar347 * 0.0 * auVar391._0_4_;
          fVar363 = fVar324 * 0.0 * auVar391._4_4_;
          fVar356 = fVar355 * 0.0 * auVar391._8_4_;
          fVar357 = fVar339 * 0.0 * auVar391._12_4_;
          fVar324 = fVar277 - fVar388;
          fVar339 = fVar322 - fVar397;
          fVar347 = fVar325 - fVar202;
          fVar355 = fVar328 - fVar206;
          fVar395 = fVar278 + fVar362;
          fVar145 = fVar323 + fVar363;
          fVar205 = fVar326 + fVar356;
          fVar250 = fVar329 + fVar357;
          fVar365 = local_188 - fVar327;
          fVar394 = fStack_184 - fVar341;
          fVar429 = fStack_180 - fVar352;
          fVar348 = fStack_17c - fVar367;
          fVar271 = fVar271 - fVar358;
          fVar272 = fVar272 - fVar364;
          fVar273 = fVar273 - fVar387;
          fVar412 = fVar412 - fVar422;
          uVar137 = -(uint)(0.0 < (fVar365 * (fVar395 - fVar271) - fVar271 * (fVar372 - fVar365)) *
                                  0.0 + (fVar271 * (fVar349 - fVar324) -
                                        (fVar395 - fVar271) * fVar324) * 0.0 +
                                        ((fVar372 - fVar365) * fVar324 -
                                        (fVar349 - fVar324) * fVar365));
          uVar139 = -(uint)(0.0 < (fVar394 * (fVar145 - fVar272) - fVar272 * (fVar380 - fVar394)) *
                                  0.0 + (fVar272 * (fVar350 - fVar339) -
                                        (fVar145 - fVar272) * fVar339) * 0.0 +
                                        ((fVar380 - fVar394) * fVar339 -
                                        (fVar350 - fVar339) * fVar394));
          uVar140 = -(uint)(0.0 < (fVar429 * (fVar205 - fVar273) - fVar273 * (fVar383 - fVar429)) *
                                  0.0 + (fVar273 * (fVar369 - fVar347) -
                                        (fVar205 - fVar273) * fVar347) * 0.0 +
                                        ((fVar383 - fVar429) * fVar347 -
                                        (fVar369 - fVar347) * fVar429));
          uVar141 = -(uint)(0.0 < (fVar348 * (fVar250 - fVar412) - fVar412 * (fVar385 - fVar348)) *
                                  0.0 + (fVar412 * (fVar370 - fVar355) -
                                        (fVar250 - fVar412) * fVar355) * 0.0 +
                                        ((fVar385 - fVar348) * fVar355 -
                                        (fVar370 - fVar355) * fVar348));
          local_358._0_4_ =
               (uint)(fVar331 - fVar371) & uVar137 | ~uVar137 & (uint)(fVar277 + fVar388);
          local_358._4_4_ =
               (uint)(fVar340 - fVar379) & uVar139 | ~uVar139 & (uint)(fVar322 + fVar397);
          fStack_350 = (float)((uint)(fVar342 - fVar382) & uVar140 |
                              ~uVar140 & (uint)(fVar325 + fVar202));
          fStack_34c = (float)((uint)(fVar343 - fVar384) & uVar141 |
                              ~uVar141 & (uint)(fVar328 + fVar206));
          fVar358 = (float)((uint)(fVar351 - fVar406) & uVar137 |
                           ~uVar137 & (uint)(local_188 + fVar327));
          fVar364 = (float)((uint)(fVar381 - fVar330) & uVar139 |
                           ~uVar139 & (uint)(fStack_184 + fVar341));
          fStack_3b0 = (float)((uint)(fVar366 - fVar276) & uVar140 |
                              ~uVar140 & (uint)(fStack_180 + fVar352));
          fStack_3ac = (float)((uint)(fVar368 - fVar321) & uVar141 |
                              ~uVar141 & (uint)(fStack_17c + fVar367));
          fVar325 = (float)((uint)(fVar278 - fVar362) & uVar137 | ~uVar137 & (uint)local_348);
          fVar328 = (float)((uint)(fVar323 - fVar363) & uVar139 | ~uVar139 & (uint)fStack_344);
          fVar331 = (float)((uint)(fVar326 - fVar356) & uVar140 | ~uVar140 & (uint)fStack_340);
          fVar340 = (float)((uint)(fVar329 - fVar357) & uVar141 | ~uVar141 & (uint)fStack_33c);
          fVar327 = (float)((uint)fVar324 & uVar137 | ~uVar137 & (uint)fVar349);
          fVar341 = (float)((uint)fVar339 & uVar139 | ~uVar139 & (uint)fVar350);
          fVar352 = (float)((uint)fVar347 & uVar140 | ~uVar140 & (uint)fVar369);
          fVar367 = (float)((uint)fVar355 & uVar141 | ~uVar141 & (uint)fVar370);
          fVar387 = (float)((uint)fVar365 & uVar137 | ~uVar137 & (uint)fVar372);
          fVar422 = (float)((uint)fVar394 & uVar139 | ~uVar139 & (uint)fVar380);
          fVar277 = (float)((uint)fVar429 & uVar140 | ~uVar140 & (uint)fVar383);
          fVar322 = (float)((uint)fVar348 & uVar141 | ~uVar141 & (uint)fVar385);
          fVar362 = (float)((uint)fVar271 & uVar137 | ~uVar137 & (uint)fVar395);
          fVar363 = (float)((uint)fVar272 & uVar139 | ~uVar139 & (uint)fVar145);
          fVar356 = (float)((uint)fVar273 & uVar140 | ~uVar140 & (uint)fVar205);
          fVar357 = (float)((uint)fVar412 & uVar141 | ~uVar141 & (uint)fVar250);
          fVar342 = (float)((uint)fVar349 & uVar137 | ~uVar137 & (uint)fVar324) -
                    (float)local_358._0_4_;
          fVar343 = (float)((uint)fVar350 & uVar139 | ~uVar139 & (uint)fVar339) -
                    (float)local_358._4_4_;
          fVar349 = (float)((uint)fVar369 & uVar140 | ~uVar140 & (uint)fVar347) - fStack_350;
          fVar350 = (float)((uint)fVar370 & uVar141 | ~uVar141 & (uint)fVar355) - fStack_34c;
          fVar365 = (float)((uint)fVar372 & uVar137 | ~uVar137 & (uint)fVar365) - fVar358;
          fVar394 = (float)((uint)fVar380 & uVar139 | ~uVar139 & (uint)fVar394) - fVar364;
          fVar429 = (float)((uint)fVar383 & uVar140 | ~uVar140 & (uint)fVar429) - fStack_3b0;
          fVar348 = (float)((uint)fVar385 & uVar141 | ~uVar141 & (uint)fVar348) - fStack_3ac;
          fVar351 = (float)((uint)fVar395 & uVar137 | ~uVar137 & (uint)fVar271) - fVar325;
          fVar381 = (float)((uint)fVar145 & uVar139 | ~uVar139 & (uint)fVar272) - fVar328;
          fVar366 = (float)((uint)fVar205 & uVar140 | ~uVar140 & (uint)fVar273) - fVar331;
          fVar368 = (float)((uint)fVar250 & uVar141 | ~uVar141 & (uint)fVar412) - fVar340;
          fVar383 = (float)local_358._0_4_ - fVar327;
          fVar385 = (float)local_358._4_4_ - fVar341;
          fVar388 = fStack_350 - fVar352;
          fVar395 = fStack_34c - fVar367;
          fVar406 = fVar358 - fVar387;
          fVar330 = fVar364 - fVar422;
          fVar276 = fStack_3b0 - fVar277;
          fVar321 = fStack_3ac - fVar322;
          local_3b8 = CONCAT44(fVar364,fVar358);
          fVar324 = fVar325 - fVar362;
          fVar339 = fVar328 - fVar363;
          fVar347 = fVar331 - fVar356;
          fVar355 = fVar340 - fVar357;
          fVar369 = (fVar358 * fVar351 - fVar325 * fVar365) * 0.0 +
                    (fVar325 * fVar342 - (float)local_358._0_4_ * fVar351) * 0.0 +
                    ((float)local_358._0_4_ * fVar365 - fVar358 * fVar342);
          fVar370 = (fVar364 * fVar381 - fVar328 * fVar394) * 0.0 +
                    (fVar328 * fVar343 - (float)local_358._4_4_ * fVar381) * 0.0 +
                    ((float)local_358._4_4_ * fVar394 - fVar364 * fVar343);
          auVar265._4_4_ = fVar370;
          auVar265._0_4_ = fVar369;
          fVar372 = (fStack_3b0 * fVar366 - fVar331 * fVar429) * 0.0 +
                    (fVar331 * fVar349 - fStack_350 * fVar366) * 0.0 +
                    (fStack_350 * fVar429 - fStack_3b0 * fVar349);
          fVar380 = (fStack_3ac * fVar368 - fVar340 * fVar348) * 0.0 +
                    (fVar340 * fVar350 - fStack_34c * fVar368) * 0.0 +
                    (fStack_34c * fVar348 - fStack_3ac * fVar350);
          auVar415._0_4_ =
               (fVar387 * fVar324 - fVar362 * fVar406) * 0.0 +
               (fVar362 * fVar383 - fVar327 * fVar324) * 0.0 +
               (fVar327 * fVar406 - fVar387 * fVar383);
          auVar415._4_4_ =
               (fVar422 * fVar339 - fVar363 * fVar330) * 0.0 +
               (fVar363 * fVar385 - fVar341 * fVar339) * 0.0 +
               (fVar341 * fVar330 - fVar422 * fVar385);
          auVar415._8_4_ =
               (fVar277 * fVar347 - fVar356 * fVar276) * 0.0 +
               (fVar356 * fVar388 - fVar352 * fVar347) * 0.0 +
               (fVar352 * fVar276 - fVar277 * fVar388);
          auVar415._12_4_ =
               (fVar322 * fVar355 - fVar357 * fVar321) * 0.0 +
               (fVar357 * fVar395 - fVar367 * fVar355) * 0.0 +
               (fVar367 * fVar321 - fVar322 * fVar395);
          auVar265._8_4_ = fVar372;
          auVar265._12_4_ = fVar380;
          auVar308 = maxps(auVar265,auVar415);
          bVar97 = auVar308._0_4_ <= 0.0 && bVar97;
          auVar266._0_4_ = -(uint)bVar97;
          bVar28 = auVar308._4_4_ <= 0.0 && bVar28;
          auVar266._4_4_ = -(uint)bVar28;
          bVar29 = auVar308._8_4_ <= 0.0 && bVar29;
          auVar266._8_4_ = -(uint)bVar29;
          bVar30 = auVar308._12_4_ <= 0.0 && bVar30;
          auVar266._12_4_ = -(uint)bVar30;
          iVar200 = movmskps((int)(bezier_basis1 + lVar133),auVar266);
          if (iVar200 == 0) {
            auVar245._8_8_ = uVar123;
            auVar245._0_8_ = uVar122;
            iVar200 = 0;
          }
          else {
            fVar327 = (ray->super_RayK<1>).tfar;
            fVar352 = fVar406 * fVar351 - fVar324 * fVar365;
            fVar367 = fVar330 * fVar381 - fVar339 * fVar394;
            fVar362 = fVar276 * fVar366 - fVar347 * fVar429;
            fVar363 = fVar321 * fVar368 - fVar355 * fVar348;
            fVar324 = fVar324 * fVar342 - fVar351 * fVar383;
            fVar339 = fVar339 * fVar343 - fVar381 * fVar385;
            fVar341 = fVar347 * fVar349 - fVar366 * fVar388;
            fVar347 = fVar355 * fVar350 - fVar368 * fVar395;
            fVar355 = fVar383 * fVar365 - fVar406 * fVar342;
            fVar356 = fVar385 * fVar394 - fVar330 * fVar343;
            fVar357 = fVar388 * fVar429 - fVar276 * fVar349;
            fVar365 = fVar395 * fVar348 - fVar321 * fVar350;
            auVar244._0_4_ = fVar324 * 0.0 + fVar355;
            auVar244._4_4_ = fVar339 * 0.0 + fVar356;
            auVar244._8_4_ = fVar341 * 0.0 + fVar357;
            auVar244._12_4_ = fVar347 * 0.0 + fVar365;
            auVar346._0_4_ = fVar352 * 0.0 + auVar244._0_4_;
            auVar346._4_4_ = fVar367 * 0.0 + auVar244._4_4_;
            auVar346._8_4_ = fVar362 * 0.0 + auVar244._8_4_;
            auVar346._12_4_ = fVar363 * 0.0 + auVar244._12_4_;
            auVar308 = rcpps(auVar244,auVar346);
            fVar406 = auVar308._0_4_;
            fVar330 = auVar308._4_4_;
            fVar276 = auVar308._8_4_;
            fVar321 = auVar308._12_4_;
            fVar406 = (1.0 - auVar346._0_4_ * fVar406) * fVar406 + fVar406;
            fVar330 = (1.0 - auVar346._4_4_ * fVar330) * fVar330 + fVar330;
            fVar276 = (1.0 - auVar346._8_4_ * fVar276) * fVar276 + fVar276;
            fVar321 = (1.0 - auVar346._12_4_ * fVar321) * fVar321 + fVar321;
            fVar324 = (fVar325 * fVar355 + fVar358 * fVar324 + (float)local_358._0_4_ * fVar352) *
                      fVar406;
            fVar339 = (fVar328 * fVar356 + fVar364 * fVar339 + (float)local_358._4_4_ * fVar367) *
                      fVar330;
            fVar341 = (fVar331 * fVar357 + fStack_3b0 * fVar341 + fStack_350 * fVar362) * fVar276;
            fVar347 = (fVar340 * fVar365 + fStack_3ac * fVar347 + fStack_34c * fVar363) * fVar321;
            bVar97 = (fVar324 <= fVar327 && local_1d8 <= fVar324) && bVar97;
            auVar314._0_4_ = -(uint)bVar97;
            bVar28 = (fVar339 <= fVar327 && fStack_1d4 <= fVar339) && bVar28;
            auVar314._4_4_ = -(uint)bVar28;
            bVar29 = (fVar341 <= fVar327 && fStack_1d0 <= fVar341) && bVar29;
            auVar314._8_4_ = -(uint)bVar29;
            bVar30 = (fVar347 <= fVar327 && fStack_1cc <= fVar347) && bVar30;
            auVar314._12_4_ = -(uint)bVar30;
            iVar200 = movmskps(iVar200,auVar314);
            if (iVar200 == 0) {
              auVar245._8_8_ = uVar123;
              auVar245._0_8_ = uVar122;
              iVar200 = 0;
            }
            else {
              auVar315._0_8_ =
                   CONCAT44(-(uint)(auVar346._4_4_ != 0.0 && bVar28),
                            -(uint)(auVar346._0_4_ != 0.0 && bVar97));
              auVar315._8_4_ = -(uint)(auVar346._8_4_ != 0.0 && bVar29);
              auVar315._12_4_ = -(uint)(auVar346._12_4_ != 0.0 && bVar30);
              iVar200 = movmskps(iVar200,auVar315);
              auVar245._8_8_ = uVar123;
              auVar245._0_8_ = uVar122;
              if (iVar200 != 0) {
                fVar369 = fVar369 * fVar406;
                fVar370 = fVar370 * fVar330;
                fVar372 = fVar372 * fVar276;
                fVar380 = fVar380 * fVar321;
                local_388 = (float)((uint)(1.0 - fVar369) & uVar137 | ~uVar137 & (uint)fVar369);
                fStack_384 = (float)((uint)(1.0 - fVar370) & uVar139 | ~uVar139 & (uint)fVar370);
                fStack_380 = (float)((uint)(1.0 - fVar372) & uVar140 | ~uVar140 & (uint)fVar372);
                fStack_37c = (float)((uint)(1.0 - fVar380) & uVar141 | ~uVar141 & (uint)fVar380);
                local_1b8 = (float)(~uVar137 & (uint)(auVar415._0_4_ * fVar406) |
                                   (uint)(1.0 - auVar415._0_4_ * fVar406) & uVar137);
                fStack_1b4 = (float)(~uVar139 & (uint)(auVar415._4_4_ * fVar330) |
                                    (uint)(1.0 - auVar415._4_4_ * fVar330) & uVar139);
                fStack_1b0 = (float)(~uVar140 & (uint)(auVar415._8_4_ * fVar276) |
                                    (uint)(1.0 - auVar415._8_4_ * fVar276) & uVar140);
                fStack_1ac = (float)(~uVar141 & (uint)(auVar415._12_4_ * fVar321) |
                                    (uint)(1.0 - auVar415._12_4_ * fVar321) & uVar141);
                auVar245._8_4_ = auVar315._8_4_;
                auVar245._0_8_ = auVar315._0_8_;
                auVar245._12_4_ = auVar315._12_4_;
                local_288 = fVar324;
                fStack_284 = fVar339;
                fStack_280 = fVar341;
                fStack_27c = fVar347;
              }
            }
          }
          iVar200 = movmskps(iVar200,auVar245);
          if (iVar200 != 0) {
            fVar330 = (auVar391._0_4_ - (float)local_3e8._0_4_) * local_388 + (float)local_3e8._0_4_
            ;
            fVar276 = (auVar391._4_4_ - (float)local_3e8._4_4_) * fStack_384 +
                      (float)local_3e8._4_4_;
            fVar321 = (auVar391._8_4_ - (float)iStack_3e0) * fStack_380 + (float)iStack_3e0;
            fVar324 = (auVar391._12_4_ - (float)iStack_3dc) * fStack_37c + (float)iStack_3dc;
            fVar406 = pre->depth_scale;
            aVar192._0_4_ = -(uint)(fVar406 * (fVar330 + fVar330) < local_288) & auVar245._0_4_;
            aVar192._4_4_ = -(uint)(fVar406 * (fVar276 + fVar276) < fStack_284) & auVar245._4_4_;
            aVar192.i[2] = -(uint)(fVar406 * (fVar321 + fVar321) < fStack_280) & auVar245._8_4_;
            aVar192.i[3] = -(uint)(fVar406 * (fVar324 + fVar324) < fStack_27c) & auVar245._12_4_;
            iVar200 = movmskps(uVar131,(undefined1  [16])aVar192);
            if (iVar200 != 0) {
              local_1b8 = local_1b8 + local_1b8 + -1.0;
              fStack_1b4 = fStack_1b4 + fStack_1b4 + -1.0;
              fStack_1b0 = fStack_1b0 + fStack_1b0 + -1.0;
              fStack_1ac = fStack_1ac + fStack_1ac + -1.0;
              bhit.U.field_0.v[0] = local_388;
              bhit.U.field_0.v[1] = fStack_384;
              bhit.U.field_0.v[2] = fStack_380;
              bhit.U.field_0.v[3] = fStack_37c;
              bhit.V.field_0.v[0] = local_1b8;
              bhit.V.field_0.v[1] = fStack_1b4;
              bhit.V.field_0.v[2] = fStack_1b0;
              bhit.V.field_0.v[3] = fStack_1ac;
              bhit.T.field_0.v[0] = local_288;
              bhit.T.field_0.v[1] = fStack_284;
              bhit.T.field_0.v[2] = fStack_280;
              bhit.T.field_0.v[3] = fStack_27c;
              bhit.i = uVar138;
              bhit.N = iVar199;
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._0_8_ =
                   CONCAT44(fStack_334,local_338);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._8_8_ =
                   CONCAT44(fStack_32c,fStack_330);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._0_8_ =
                   CONCAT44(fVar420,fVar411);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._8_8_ =
                   CONCAT44(fVar427,fVar426);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._0_8_ =
                   CONCAT44(fVar434,fVar431);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._8_8_ =
                   CONCAT44(fVar410,fVar408);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._0_8_ =
                   CONCAT44(fVar405,fVar404);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._8_8_ =
                   CONCAT44(fVar409,fVar407);
              bhit.valid.field_0 = aVar192;
              pGVar25 = (context->scene->geometries).items[(long)local_390].ptr;
              uVar137 = (ray->super_RayK<1>).mask;
              pRVar129 = local_390;
              if ((pGVar25->mask & uVar137) != 0) {
                valid.field_0 = aVar192;
                fVar406 = (float)(int)uVar138;
                bhit.vu.field_0.v[0] = (fVar406 + local_388 + 0.0) * local_208;
                bhit.vu.field_0.v[1] = (fVar406 + fStack_384 + 1.0) * fStack_204;
                bhit.vu.field_0.v[2] = (fVar406 + fStack_380 + 2.0) * fStack_200;
                bhit.vu.field_0.v[3] = (fVar406 + fStack_37c + 3.0) * fStack_1fc;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_1b4,local_1b8);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_1ac,fStack_1b0);
                bhit.vt.field_0.v[0] = local_288;
                bhit.vt.field_0.v[1] = fStack_284;
                bhit.vt.field_0.v[2] = fStack_280;
                bhit.vt.field_0.v[3] = fStack_27c;
                auVar217._0_4_ = aVar192._0_4_ & (uint)local_288;
                auVar217._4_4_ = aVar192._4_4_ & (uint)fStack_284;
                auVar217._8_4_ = aVar192.i[2] & (uint)fStack_280;
                auVar217._12_4_ = aVar192.i[3] & (uint)fStack_27c;
                auVar246._0_8_ = CONCAT44(~aVar192._4_4_,~aVar192._0_4_) & 0x7f8000007f800000;
                auVar246._8_4_ = ~aVar192.i[2] & 0x7f800000;
                auVar246._12_4_ = ~aVar192.i[3] & 0x7f800000;
                auVar246 = auVar246 | auVar217;
                auVar267._4_4_ = auVar246._0_4_;
                auVar267._0_4_ = auVar246._4_4_;
                auVar267._8_4_ = auVar246._12_4_;
                auVar267._12_4_ = auVar246._8_4_;
                auVar308 = minps(auVar267,auVar246);
                auVar218._0_8_ = auVar308._8_8_;
                auVar218._8_4_ = auVar308._0_4_;
                auVar218._12_4_ = auVar308._4_4_;
                auVar308 = minps(auVar218,auVar308);
                auVar219._0_8_ =
                     CONCAT44(-(uint)(auVar308._4_4_ == auVar246._4_4_) & aVar192._4_4_,
                              -(uint)(auVar308._0_4_ == auVar246._0_4_) & aVar192._0_4_);
                auVar219._8_4_ = -(uint)(auVar308._8_4_ == auVar246._8_4_) & aVar192.i[2];
                auVar219._12_4_ = -(uint)(auVar308._12_4_ == auVar246._12_4_) & aVar192.i[3];
                iVar200 = movmskps(uVar137,auVar219);
                if (iVar200 != 0) {
                  aVar192.i[2] = auVar219._8_4_;
                  aVar192._0_8_ = auVar219._0_8_;
                  aVar192.i[3] = auVar219._12_4_;
                }
                uVar137 = movmskps(iVar200,(undefined1  [16])aVar192);
                lVar136 = 0;
                if (uVar137 != 0) {
                  for (; (uVar137 >> lVar136 & 1) == 0; lVar136 = lVar136 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar25->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar406 = bhit.vu.field_0.v[lVar136];
                  fVar330 = bhit.vv.field_0.v[lVar136];
                  fVar276 = 1.0 - fVar406;
                  fVar324 = fVar406 * fVar276 + fVar406 * fVar276;
                  fVar321 = fVar276 * fVar276 * -3.0;
                  fVar327 = (fVar276 * fVar276 - fVar324) * 3.0;
                  fVar276 = (fVar324 - fVar406 * fVar406) * 3.0;
                  fVar324 = fVar406 * fVar406 * 3.0;
                  (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar136];
                  *(ulong *)&(ray->Ng).field_0 =
                       CONCAT44(fVar321 * fStack_334 +
                                fVar327 * fVar420 + fVar276 * fVar434 + fVar324 * fVar405,
                                fVar321 * local_338 +
                                fVar327 * fVar411 + fVar276 * fVar431 + fVar324 * fVar404);
                  (ray->Ng).field_0.field_0.z =
                       fVar321 * fStack_330 +
                       fVar327 * fVar426 + fVar276 * fVar408 + fVar324 * fVar407;
                  ray->u = fVar406;
                  ray->v = fVar330;
                  ray->primID = (uint)local_360;
                  ray->geomID = (uint)local_390;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                  pRVar129 = (RTCIntersectArguments *)context;
                }
                else {
                  local_3e8._0_4_ = iVar199;
                  local_3b8 = lVar134;
                  _local_468 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
LAB_003a3533:
                  local_23c = bhit.vu.field_0.v[lVar136];
                  local_238 = bhit.vv.field_0.v[lVar136];
                  (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar136];
                  args.context = context->user;
                  fVar406 = 1.0 - local_23c;
                  fVar276 = local_23c * fVar406 + local_23c * fVar406;
                  fVar330 = fVar406 * fVar406 * -3.0;
                  fVar321 = (fVar406 * fVar406 - fVar276) * 3.0;
                  fVar406 = (fVar276 - local_23c * local_23c) * 3.0;
                  fVar276 = local_23c * local_23c * 3.0;
                  local_248 = CONCAT44(fVar330 * fStack_334 +
                                       fVar321 * fVar420 + fVar406 * fVar434 + fVar276 * fVar405,
                                       fVar330 * local_338 +
                                       fVar321 * fVar411 + fVar406 * fVar431 + fVar276 * fVar404);
                  local_240 = fVar330 * fStack_330 +
                              fVar321 * fVar426 + fVar406 * fVar408 + fVar276 * fVar407;
                  local_234 = (int)local_360;
                  local_230 = (int)local_390;
                  local_22c = (args.context)->instID[0];
                  local_228 = (args.context)->instPrimID[0];
                  local_42c = -1;
                  args.valid = &local_42c;
                  pRVar129 = (RTCIntersectArguments *)pGVar25->userPtr;
                  args.geometryUserPtr = pRVar129;
                  args.ray = (RTCRayN *)ray;
                  args.hit = (RTCHitN *)&local_248;
                  args.N = 1;
                  if ((pGVar25->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar25->intersectionFilterN)(&args), uVar130 = extraout_RDX,
                     *args.valid != 0)) {
                    pRVar129 = context->args;
                    if (((RTCIntersectArguments *)pRVar129->filter != (RTCIntersectArguments *)0x0)
                       && (((((ulong)*(Scene **)&pRVar129->flags & 2) != 0 ||
                            (((pGVar25->field_8).field_0x2 & 0x40) != 0)) &&
                           ((*(code *)pRVar129->filter)(&args), uVar130 = extraout_RDX_00,
                           *args.valid == 0)))) goto LAB_003a374c;
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    uVar130 = (ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    pRVar129 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                    *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                    pRVar127 = args.ray;
                  }
                  else {
LAB_003a374c:
                    (ray->super_RayK<1>).tfar = (float)local_468._0_4_;
                    pRVar127 = (RTCRayN *)args.valid;
                  }
                  valid.field_0.v[lVar136] = 0.0;
                  fVar406 = (ray->super_RayK<1>).tfar;
                  local_468._0_4_ = (ray->super_RayK<1>).tfar;
                  unique0x100053b5 = (float)(ray->super_RayK<1>).mask;
                  fStack_460 = (float)(ray->super_RayK<1>).id;
                  unique0x100053bd = (ray->super_RayK<1>).flags;
                  aVar193._0_4_ = -(uint)(local_288 <= fVar406) & valid.field_0.i[0];
                  aVar193._4_4_ = -(uint)(fStack_284 <= fVar406) & valid.field_0.i[1];
                  aVar193.i[2] = -(uint)(fStack_280 <= fVar406) & valid.field_0.i[2];
                  aVar193.i[3] = -(uint)(fStack_27c <= fVar406) & valid.field_0.i[3];
                  valid.field_0 = aVar193;
                  iVar199 = movmskps((int)pRVar127,(undefined1  [16])aVar193);
                  if (iVar199 != 0) {
                    auVar220._0_4_ = aVar193._0_4_ & (uint)local_288;
                    auVar220._4_4_ = aVar193._4_4_ & (uint)fStack_284;
                    auVar220._8_4_ = aVar193.i[2] & (uint)fStack_280;
                    auVar220._12_4_ = aVar193.i[3] & (uint)fStack_27c;
                    auVar247._0_8_ = CONCAT44(~aVar193._4_4_,~aVar193._0_4_) & 0x7f8000007f800000;
                    auVar247._8_4_ = ~aVar193.i[2] & 0x7f800000;
                    auVar247._12_4_ = ~aVar193.i[3] & 0x7f800000;
                    auVar247 = auVar247 | auVar220;
                    auVar268._4_4_ = auVar247._0_4_;
                    auVar268._0_4_ = auVar247._4_4_;
                    auVar268._8_4_ = auVar247._12_4_;
                    auVar268._12_4_ = auVar247._8_4_;
                    auVar308 = minps(auVar268,auVar247);
                    auVar221._0_8_ = auVar308._8_8_;
                    auVar221._8_4_ = auVar308._0_4_;
                    auVar221._12_4_ = auVar308._4_4_;
                    auVar308 = minps(auVar221,auVar308);
                    auVar222._0_8_ =
                         CONCAT44(-(uint)(auVar308._4_4_ == auVar247._4_4_) & aVar193._4_4_,
                                  -(uint)(auVar308._0_4_ == auVar247._0_4_) & aVar193._0_4_);
                    auVar222._8_4_ = -(uint)(auVar308._8_4_ == auVar247._8_4_) & aVar193.i[2];
                    auVar222._12_4_ = -(uint)(auVar308._12_4_ == auVar247._12_4_) & aVar193.i[3];
                    iVar199 = movmskps(iVar199,auVar222);
                    if (iVar199 != 0) {
                      aVar193.i[2] = auVar222._8_4_;
                      aVar193._0_8_ = auVar222._0_8_;
                      aVar193.i[3] = auVar222._12_4_;
                    }
                    uVar124 = movmskps(iVar199,(undefined1  [16])aVar193);
                    uVar128 = CONCAT44((int)((ulong)pRVar127 >> 0x20),uVar124);
                    lVar136 = 0;
                    if (uVar128 != 0) {
                      for (; (uVar128 >> lVar136 & 1) == 0; lVar136 = lVar136 + 1) {
                      }
                    }
                    goto LAB_003a3533;
                  }
                  lVar134 = local_3b8;
                  fVar359 = (float)local_408;
                  fVar435 = local_408._4_4_;
                  iVar199 = local_3e8._0_4_;
                }
              }
            }
          }
        }
        lVar135 = lVar135 + 4;
        fVar330 = fStack_400;
        fVar276 = fStack_3fc;
      }
    }
    fVar406 = (ray->super_RayK<1>).tfar;
    auVar216._4_4_ = -(uint)(fVar316 <= fVar406);
    auVar216._0_4_ = -(uint)(fVar274 <= fVar406);
    auVar216._8_4_ = -(uint)(fVar204 <= fVar406);
    auVar216._12_4_ = -(uint)(fVar275 <= fVar406);
    uVar137 = movmskps(uVar124,auVar216);
    uVar132 = (ulong)((uint)uVar132 & (uint)uVar132 + 0xf & uVar137);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }